

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  uint uVar58;
  int iVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  byte bVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  uint uVar68;
  float fVar69;
  float fVar70;
  undefined4 uVar71;
  float fVar98;
  float fVar99;
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar100;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined8 uVar101;
  vint4 bi_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar142;
  float fVar143;
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar144;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar165;
  float fVar166;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar167;
  undefined1 auVar150 [16];
  float fVar146;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar147;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_2;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar202;
  float fVar203;
  vint4 ai_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  vint4 ai;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar233;
  float fVar234;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar235;
  undefined1 auVar232 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar293 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar247 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar255;
  float fVar269;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [64];
  undefined1 auVar292 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  float fVar313;
  float fVar325;
  float fVar326;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar327;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar319 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar335 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  uint local_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  RTCFilterFunctionNArguments local_550;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  uint auStack_4b0 [4];
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  uint uStack_360;
  float afStack_35c [7];
  undefined1 local_340 [32];
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar334 [32];
  
  PVar6 = prim[1];
  uVar61 = (ulong)(byte)PVar6;
  lVar63 = uVar61 * 0x25;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar69 = *(float *)(prim + lVar63 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar63 + 6));
  auVar293._0_4_ = fVar69 * auVar15._0_4_;
  auVar293._4_4_ = fVar69 * auVar15._4_4_;
  auVar293._8_4_ = fVar69 * auVar15._8_4_;
  auVar293._12_4_ = fVar69 * auVar15._12_4_;
  auVar110._0_4_ = fVar69 * auVar16._0_4_;
  auVar110._4_4_ = fVar69 * auVar16._4_4_;
  auVar110._8_4_ = fVar69 * auVar16._8_4_;
  auVar110._12_4_ = fVar69 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xf + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar61 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar314._4_4_ = auVar110._0_4_;
  auVar314._0_4_ = auVar110._0_4_;
  auVar314._8_4_ = auVar110._0_4_;
  auVar314._12_4_ = auVar110._0_4_;
  auVar24 = vshufps_avx(auVar110,auVar110,0x55);
  auVar328 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar69 = auVar328._0_4_;
  auVar270._0_4_ = fVar69 * auVar158._0_4_;
  fVar98 = auVar328._4_4_;
  auVar270._4_4_ = fVar98 * auVar158._4_4_;
  fVar99 = auVar328._8_4_;
  auVar270._8_4_ = fVar99 * auVar158._8_4_;
  fVar147 = auVar328._12_4_;
  auVar270._12_4_ = fVar147 * auVar158._12_4_;
  auVar256._0_4_ = auVar20._0_4_ * fVar69;
  auVar256._4_4_ = auVar20._4_4_ * fVar98;
  auVar256._8_4_ = auVar20._8_4_ * fVar99;
  auVar256._12_4_ = auVar20._12_4_ * fVar147;
  auVar239._0_4_ = auVar23._0_4_ * fVar69;
  auVar239._4_4_ = auVar23._4_4_ * fVar98;
  auVar239._8_4_ = auVar23._8_4_ * fVar99;
  auVar239._12_4_ = auVar23._12_4_ * fVar147;
  auVar328 = vfmadd231ps_fma(auVar270,auVar24,auVar16);
  auVar245 = vfmadd231ps_fma(auVar256,auVar24,auVar19);
  auVar24 = vfmadd231ps_fma(auVar239,auVar22,auVar24);
  auVar73 = vfmadd231ps_fma(auVar328,auVar314,auVar15);
  auVar245 = vfmadd231ps_fma(auVar245,auVar314,auVar18);
  auVar74 = vfmadd231ps_fma(auVar24,auVar21,auVar314);
  auVar315._4_4_ = auVar293._0_4_;
  auVar315._0_4_ = auVar293._0_4_;
  auVar315._8_4_ = auVar293._0_4_;
  auVar315._12_4_ = auVar293._0_4_;
  auVar24 = vshufps_avx(auVar293,auVar293,0x55);
  auVar328 = vshufps_avx(auVar293,auVar293,0xaa);
  fVar69 = auVar328._0_4_;
  auVar287._0_4_ = fVar69 * auVar158._0_4_;
  fVar98 = auVar328._4_4_;
  auVar287._4_4_ = fVar98 * auVar158._4_4_;
  fVar99 = auVar328._8_4_;
  auVar287._8_4_ = fVar99 * auVar158._8_4_;
  fVar147 = auVar328._12_4_;
  auVar287._12_4_ = fVar147 * auVar158._12_4_;
  auVar102._0_4_ = auVar20._0_4_ * fVar69;
  auVar102._4_4_ = auVar20._4_4_ * fVar98;
  auVar102._8_4_ = auVar20._8_4_ * fVar99;
  auVar102._12_4_ = auVar20._12_4_ * fVar147;
  auVar72._0_4_ = auVar23._0_4_ * fVar69;
  auVar72._4_4_ = auVar23._4_4_ * fVar98;
  auVar72._8_4_ = auVar23._8_4_ * fVar99;
  auVar72._12_4_ = auVar23._12_4_ * fVar147;
  auVar16 = vfmadd231ps_fma(auVar287,auVar24,auVar16);
  auVar158 = vfmadd231ps_fma(auVar102,auVar24,auVar19);
  auVar19 = vfmadd231ps_fma(auVar72,auVar24,auVar22);
  auVar102 = vfmadd231ps_fma(auVar16,auVar315,auVar15);
  auVar103 = vfmadd231ps_fma(auVar158,auVar315,auVar18);
  local_4c0._8_4_ = 0x7fffffff;
  local_4c0._0_8_ = 0x7fffffff7fffffff;
  local_4c0._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar73,local_4c0);
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar221,1);
  auVar16 = vblendvps_avx(auVar73,auVar221,auVar15);
  auVar15 = vandps_avx(auVar245,local_4c0);
  auVar15 = vcmpps_avx(auVar15,auVar221,1);
  auVar158 = vblendvps_avx(auVar245,auVar221,auVar15);
  auVar15 = vandps_avx(auVar74,local_4c0);
  auVar15 = vcmpps_avx(auVar15,auVar221,1);
  auVar15 = vblendvps_avx(auVar74,auVar221,auVar15);
  auVar104 = vfmadd231ps_fma(auVar19,auVar315,auVar21);
  auVar18 = vrcpps_avx(auVar16);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar222);
  auVar73 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar158);
  auVar158 = vfnmadd213ps_fma(auVar158,auVar16,auVar222);
  auVar74 = vfmadd132ps_fma(auVar158,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar222);
  auVar293 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  fVar69 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar63 + 0x16)) *
           *(float *)(prim + lVar63 + 0x1a);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar190._4_4_ = fVar69;
  auVar190._0_4_ = fVar69;
  auVar190._8_4_ = fVar69;
  auVar190._12_4_ = fVar69;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar72 = vfmadd213ps_fma(auVar16,auVar190,auVar15);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar158);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar61 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar158 = vfmadd213ps_fma(auVar16,auVar190,auVar15);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar61 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  uVar62 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar61 * 2 + uVar62 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar18 = vfmadd213ps_fma(auVar16,auVar190,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar61 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar22);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar19 = vfmadd213ps_fma(auVar16,auVar190,auVar15);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar61 * 0x1d + 6);
  auVar15 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar61 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar24);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar20 = vfmadd213ps_fma(auVar16,auVar190,auVar15);
  auVar328._8_8_ = 0;
  auVar328._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar61) + 6);
  auVar15 = vpmovsxwd_avx(auVar328);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *(ulong *)(prim + uVar61 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar245);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar16 = vfmadd213ps_fma(auVar16,auVar190,auVar15);
  auVar15 = vsubps_avx(auVar72,auVar102);
  auVar204._0_4_ = auVar73._0_4_ * auVar15._0_4_;
  auVar204._4_4_ = auVar73._4_4_ * auVar15._4_4_;
  auVar204._8_4_ = auVar73._8_4_ * auVar15._8_4_;
  auVar204._12_4_ = auVar73._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar158,auVar102);
  auVar130._0_4_ = auVar73._0_4_ * auVar15._0_4_;
  auVar130._4_4_ = auVar73._4_4_ * auVar15._4_4_;
  auVar130._8_4_ = auVar73._8_4_ * auVar15._8_4_;
  auVar130._12_4_ = auVar73._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar18,auVar103);
  auVar183._0_4_ = auVar74._0_4_ * auVar15._0_4_;
  auVar183._4_4_ = auVar74._4_4_ * auVar15._4_4_;
  auVar183._8_4_ = auVar74._8_4_ * auVar15._8_4_;
  auVar183._12_4_ = auVar74._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar19,auVar103);
  auVar103._0_4_ = auVar74._0_4_ * auVar15._0_4_;
  auVar103._4_4_ = auVar74._4_4_ * auVar15._4_4_;
  auVar103._8_4_ = auVar74._8_4_ * auVar15._8_4_;
  auVar103._12_4_ = auVar74._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar20,auVar104);
  auVar155._0_4_ = auVar293._0_4_ * auVar15._0_4_;
  auVar155._4_4_ = auVar293._4_4_ * auVar15._4_4_;
  auVar155._8_4_ = auVar293._8_4_ * auVar15._8_4_;
  auVar155._12_4_ = auVar293._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar16,auVar104);
  auVar73._0_4_ = auVar293._0_4_ * auVar15._0_4_;
  auVar73._4_4_ = auVar293._4_4_ * auVar15._4_4_;
  auVar73._8_4_ = auVar293._8_4_ * auVar15._8_4_;
  auVar73._12_4_ = auVar293._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar204,auVar130);
  auVar16 = vpminsd_avx(auVar183,auVar103);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar155,auVar73);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar240._4_4_ = uVar71;
  auVar240._0_4_ = uVar71;
  auVar240._8_4_ = uVar71;
  auVar240._12_4_ = uVar71;
  auVar16 = vmaxps_avx(auVar16,auVar240);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_470._0_4_ = auVar15._0_4_ * 0.99999964;
  local_470._4_4_ = auVar15._4_4_ * 0.99999964;
  local_470._8_4_ = auVar15._8_4_ * 0.99999964;
  local_470._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar204,auVar130);
  auVar16 = vpmaxsd_avx(auVar183,auVar103);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar155,auVar73);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar131._4_4_ = uVar71;
  auVar131._0_4_ = uVar71;
  auVar131._8_4_ = uVar71;
  auVar131._12_4_ = uVar71;
  auVar16 = vminps_avx(auVar16,auVar131);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar74._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar104._1_3_ = 0;
  auVar104[0] = PVar6;
  auVar104[4] = PVar6;
  auVar104._5_3_ = 0;
  auVar104[8] = PVar6;
  auVar104._9_3_ = 0;
  auVar104[0xc] = PVar6;
  auVar104._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar104,_DAT_01f7fcf0);
  auVar15 = vcmpps_avx(local_470,auVar74,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar58 = vmovmskps_avx(auVar15);
  if (uVar58 == 0) {
    return;
  }
  uVar58 = uVar58 & 0xff;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  iVar59 = 1 << ((uint)k & 0x1f);
  auVar94._4_4_ = iVar59;
  auVar94._0_4_ = iVar59;
  auVar94._8_4_ = iVar59;
  auVar94._12_4_ = iVar59;
  auVar94._16_4_ = iVar59;
  auVar94._20_4_ = iVar59;
  auVar94._24_4_ = iVar59;
  auVar94._28_4_ = iVar59;
  auVar26 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar93 = vpand_avx2(auVar94,auVar26);
  local_340 = vpcmpeqd_avx2(auVar93,auVar26);
  do {
    lVar63 = 0;
    for (uVar61 = (ulong)uVar58; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      lVar63 = lVar63 + 1;
    }
    uVar60 = *(uint *)(prim + 2);
    uVar7 = *(uint *)(prim + lVar63 * 4 + 6);
    pGVar8 = (context->scene->geometries).items[uVar60].ptr;
    fVar69 = (pGVar8->time_range).lower;
    fVar99 = pGVar8->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0xe0) - fVar69) / ((pGVar8->time_range).upper - fVar69));
    auVar15 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),9);
    auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar24 = vmaxss_avx(ZEXT816(0),auVar15);
    uVar61 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)uVar7 *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar67 = (long)(int)auVar24._0_4_ * 0x38;
    lVar10 = *(long *)(_Var9 + lVar67);
    lVar11 = *(long *)(_Var9 + 0x10 + lVar67);
    auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar61);
    lVar63 = uVar61 + 1;
    auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar63);
    lVar1 = uVar61 + 2;
    auVar158 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
    lVar2 = uVar61 + 3;
    pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
    auVar56 = *pauVar3;
    fVar69 = *(float *)pauVar3[1];
    lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
    lVar11 = *(long *)(lVar10 + lVar67);
    lVar12 = *(long *)(lVar10 + 0x10 + lVar67);
    auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar61);
    auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar63);
    auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
    fVar98 = *pfVar4;
    fVar147 = pfVar4[1];
    fVar70 = pfVar4[2];
    fVar146 = pfVar4[3];
    auVar328 = ZEXT816(0) << 0x40;
    auVar292._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar292._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar292._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar292._12_4_ = fVar69 * 0.0;
    auVar241._8_4_ = 0x3e2aaaab;
    auVar241._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar241._12_4_ = 0x3e2aaaab;
    auVar73 = vfmadd213ps_fma(auVar241,auVar158,auVar292);
    auVar302._8_4_ = 0x3f000000;
    auVar302._0_8_ = 0x3f0000003f000000;
    auVar302._12_4_ = 0x3f000000;
    auVar21 = vfmadd231ps_fma(auVar292,auVar158,auVar302);
    auVar21 = vfnmadd231ps_fma(auVar21,auVar16,auVar328);
    auVar130 = vfnmadd231ps_fma(auVar21,auVar15,auVar302);
    auVar184._0_4_ = fVar98 * 0.0;
    auVar184._4_4_ = fVar147 * 0.0;
    auVar184._8_4_ = fVar70 * 0.0;
    auVar184._12_4_ = fVar146 * 0.0;
    auVar21 = vfmadd213ps_fma(auVar241,auVar20,auVar184);
    auVar148._8_4_ = 0x3f2aaaab;
    auVar148._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar148._12_4_ = 0x3f2aaaab;
    auVar21 = vfmadd231ps_fma(auVar21,auVar19,auVar148);
    auVar21 = vfmadd231ps_fma(auVar21,auVar18,auVar241);
    auVar22 = vfmadd231ps_fma(auVar184,auVar20,auVar302);
    auVar22 = vfnmadd231ps_fma(auVar22,auVar19,auVar328);
    auVar23 = vfnmadd231ps_fma(auVar22,auVar18,auVar302);
    auVar316._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar316._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar316._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar316._12_4_ = fVar69 * 0.5;
    auVar22 = vfmadd231ps_fma(auVar316,auVar328,auVar158);
    auVar22 = vfnmadd231ps_fma(auVar22,auVar302,auVar16);
    auVar131 = vfnmadd231ps_fma(auVar22,auVar328,auVar15);
    auVar257._0_4_ = fVar98 * 0.16666667;
    auVar257._4_4_ = fVar147 * 0.16666667;
    auVar257._8_4_ = fVar70 * 0.16666667;
    auVar257._12_4_ = fVar146 * 0.16666667;
    auVar22 = vfmadd231ps_fma(auVar257,auVar20,auVar148);
    auVar22 = vfmadd231ps_fma(auVar22,auVar19,auVar241);
    auVar22 = vfmadd231ps_fma(auVar22,auVar18,auVar328);
    auVar223._0_4_ = fVar98 * 0.5;
    auVar223._4_4_ = fVar147 * 0.5;
    auVar223._8_4_ = fVar70 * 0.5;
    auVar223._12_4_ = fVar146 * 0.5;
    auVar20 = vfmadd231ps_fma(auVar223,auVar328,auVar20);
    auVar19 = vfnmadd231ps_fma(auVar20,auVar302,auVar19);
    auVar20 = vfnmadd231ps_fma(auVar19,auVar328,auVar18);
    auVar18 = vshufps_avx(auVar130,auVar130,0xc9);
    auVar19 = vshufps_avx(auVar21,auVar21,0xc9);
    fVar238 = auVar130._0_4_;
    auVar105._0_4_ = fVar238 * auVar19._0_4_;
    fVar255 = auVar130._4_4_;
    auVar105._4_4_ = fVar255 * auVar19._4_4_;
    fVar269 = auVar130._8_4_;
    auVar105._8_4_ = fVar269 * auVar19._8_4_;
    fVar100 = auVar130._12_4_;
    auVar105._12_4_ = fVar100 * auVar19._12_4_;
    auVar293 = vfmsub231ps_fma(auVar105,auVar18,auVar21);
    auVar19 = vshufps_avx(auVar23,auVar23,0xc9);
    auVar106._0_4_ = fVar238 * auVar19._0_4_;
    auVar106._4_4_ = fVar255 * auVar19._4_4_;
    auVar106._8_4_ = fVar269 * auVar19._8_4_;
    auVar106._12_4_ = fVar100 * auVar19._12_4_;
    auVar72 = vfmsub231ps_fma(auVar106,auVar18,auVar23);
    auVar18 = vshufps_avx(auVar131,auVar131,0xc9);
    auVar19 = vshufps_avx(auVar22,auVar22,0xc9);
    fVar313 = auVar131._0_4_;
    auVar107._0_4_ = fVar313 * auVar19._0_4_;
    fVar325 = auVar131._4_4_;
    auVar107._4_4_ = fVar325 * auVar19._4_4_;
    fVar326 = auVar131._8_4_;
    auVar107._8_4_ = fVar326 * auVar19._8_4_;
    fVar327 = auVar131._12_4_;
    auVar107._12_4_ = fVar327 * auVar19._12_4_;
    auVar102 = vfmsub231ps_fma(auVar107,auVar18,auVar22);
    auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
    auVar108._0_4_ = fVar313 * auVar19._0_4_;
    auVar108._4_4_ = fVar325 * auVar19._4_4_;
    auVar108._8_4_ = fVar326 * auVar19._8_4_;
    auVar108._12_4_ = fVar327 * auVar19._12_4_;
    auVar103 = vfmsub231ps_fma(auVar108,auVar18,auVar20);
    lVar11 = *(long *)(_Var9 + 0x38 + lVar67);
    lVar12 = *(long *)(_Var9 + 0x48 + lVar67);
    auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
    auVar57 = *pauVar3;
    fVar146 = *(float *)pauVar3[1];
    lVar13 = *(long *)(lVar10 + 0x38 + lVar67);
    lVar10 = *(long *)(lVar10 + 0x48 + lVar67);
    auVar258._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar258._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar258._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar258._12_4_ = fVar146 * 0.0;
    auVar74 = vfmadd213ps_fma(auVar241,auVar18,auVar258);
    auVar20 = vfmadd231ps_fma(auVar258,auVar18,auVar302);
    auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar63);
    auVar21 = vfnmadd231ps_fma(auVar20,auVar19,ZEXT816(0) << 0x20);
    auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar61);
    auVar155 = vfnmadd231ps_fma(auVar21,auVar20,auVar302);
    auVar21 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
    pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
    fVar98 = *pfVar4;
    fVar147 = pfVar4[1];
    fVar70 = pfVar4[2];
    fVar129 = pfVar4[3];
    auVar75._0_4_ = fVar98 * 0.0;
    auVar75._4_4_ = fVar147 * 0.0;
    auVar75._8_4_ = fVar70 * 0.0;
    auVar75._12_4_ = fVar129 * 0.0;
    auVar23 = vfmadd213ps_fma(auVar241,auVar21,auVar75);
    auVar22 = *(undefined1 (*) [16])(lVar13 + lVar63 * lVar10);
    auVar109._8_4_ = 0x3f2aaaab;
    auVar109._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar109._12_4_ = 0x3f2aaaab;
    auVar328 = vfmadd231ps_fma(auVar23,auVar22,auVar109);
    auVar23 = *(undefined1 (*) [16])(lVar13 + uVar61 * lVar10);
    auVar245 = vfmadd231ps_fma(auVar328,auVar23,auVar241);
    auVar328 = vshufps_avx(auVar245,auVar245,0xc9);
    fVar234 = auVar155._0_4_;
    auVar185._0_4_ = fVar234 * auVar328._0_4_;
    fVar235 = auVar155._4_4_;
    auVar185._4_4_ = fVar235 * auVar328._4_4_;
    fVar236 = auVar155._8_4_;
    auVar185._8_4_ = fVar236 * auVar328._8_4_;
    fVar237 = auVar155._12_4_;
    auVar185._12_4_ = fVar237 * auVar328._12_4_;
    auVar328 = vshufps_avx(auVar155,auVar155,0xc9);
    auVar104 = vfmsub231ps_fma(auVar185,auVar328,auVar245);
    auVar186._8_4_ = 0x3f000000;
    auVar186._0_8_ = 0x3f0000003f000000;
    auVar186._12_4_ = 0x3f000000;
    auVar245 = vfmadd231ps_fma(auVar75,auVar21,auVar186);
    auVar245 = vfnmadd231ps_fma(auVar245,auVar22,_DAT_01f7aa10);
    auVar110 = vfnmadd231ps_fma(auVar245,auVar23,auVar186);
    auVar245 = vshufps_avx(auVar110,auVar110,0xc9);
    auVar281._0_4_ = fVar234 * auVar245._0_4_;
    auVar281._4_4_ = fVar235 * auVar245._4_4_;
    auVar281._8_4_ = fVar236 * auVar245._8_4_;
    auVar281._12_4_ = fVar237 * auVar245._12_4_;
    auVar245 = vfmsub231ps_fma(auVar281,auVar328,auVar110);
    auVar76._0_4_ = fVar98 * 0.16666667;
    auVar76._4_4_ = fVar147 * 0.16666667;
    auVar76._8_4_ = fVar70 * 0.16666667;
    auVar76._12_4_ = fVar129 * 0.16666667;
    auVar205._8_4_ = 0x3f2aaaab;
    auVar205._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar205._12_4_ = 0x3f2aaaab;
    auVar328 = vfmadd231ps_fma(auVar76,auVar21,auVar205);
    auVar149._0_4_ = fVar98 * 0.5;
    auVar149._4_4_ = fVar147 * 0.5;
    auVar149._8_4_ = fVar70 * 0.5;
    auVar149._12_4_ = fVar129 * 0.5;
    auVar110 = ZEXT816(0) << 0x20;
    auVar21 = vfmadd231ps_fma(auVar149,auVar110,auVar21);
    auVar328 = vfmadd231ps_fma(auVar328,auVar22,auVar241);
    auVar21 = vfnmadd231ps_fma(auVar21,auVar186,auVar22);
    auVar22 = vfmadd231ps_fma(auVar328,auVar23,auVar110);
    auVar23 = vfnmadd231ps_fma(auVar21,auVar110,auVar23);
    auVar187._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar187._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar187._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar187._12_4_ = fVar146 * 0.5;
    auVar21 = vfmadd231ps_fma(auVar187,auVar110,auVar18);
    auVar21 = vfnmadd231ps_fma(auVar21,auVar186,auVar19);
    auVar183 = vfnmadd231ps_fma(auVar21,auVar110,auVar20);
    auVar21 = vshufps_avx(auVar22,auVar22,0xc9);
    fVar182 = auVar183._0_4_;
    auVar111._0_4_ = fVar182 * auVar21._0_4_;
    fVar202 = auVar183._4_4_;
    auVar111._4_4_ = fVar202 * auVar21._4_4_;
    fVar203 = auVar183._8_4_;
    auVar111._8_4_ = fVar203 * auVar21._8_4_;
    fVar233 = auVar183._12_4_;
    auVar111._12_4_ = fVar233 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar183,auVar183,0xc9);
    auVar110 = vfmsub231ps_fma(auVar111,auVar21,auVar22);
    auVar22 = vshufps_avx(auVar23,auVar23,0xc9);
    auVar77._0_4_ = fVar182 * auVar22._0_4_;
    auVar77._4_4_ = fVar202 * auVar22._4_4_;
    auVar77._8_4_ = fVar203 * auVar22._8_4_;
    auVar77._12_4_ = fVar233 * auVar22._12_4_;
    auVar287 = vfmsub231ps_fma(auVar77,auVar21,auVar23);
    fVar99 = fVar99 - auVar24._0_4_;
    local_660._0_4_ = auVar56._0_4_;
    local_660._4_4_ = auVar56._4_4_;
    fStack_658 = auVar56._8_4_;
    auVar112._0_4_ = (float)local_660._0_4_ * 0.16666667;
    auVar112._4_4_ = (float)local_660._4_4_ * 0.16666667;
    auVar112._8_4_ = fStack_658 * 0.16666667;
    auVar112._12_4_ = fVar69 * 0.16666667;
    auVar158 = vfmadd231ps_fma(auVar112,auVar205,auVar158);
    auVar21 = vfmadd231ps_fma(auVar73,auVar16,auVar205);
    auVar22 = vfmadd231ps_fma(auVar158,auVar16,auVar241);
    auVar24 = vfmadd231ps_fma(auVar21,auVar15,auVar241);
    auVar158 = vpermilps_avx(auVar293,0xc9);
    auVar16 = vdpps_avx(auVar158,auVar158,0x7f);
    auVar328 = vfmadd231ps_fma(auVar22,auVar15,ZEXT816(0) << 0x20);
    fVar98 = auVar16._0_4_;
    auVar168._4_12_ = SUB1612(ZEXT816(0),0);
    auVar168._0_4_ = fVar98;
    auVar15 = vrsqrtss_avx(auVar168,auVar168);
    fVar69 = auVar15._0_4_;
    fVar69 = fVar98 * -0.5 * fVar69 * fVar69 * fVar69 + fVar69 * 1.5;
    auVar15 = vpermilps_avx(auVar72,0xc9);
    auVar329._0_4_ = fVar98 * auVar15._0_4_;
    auVar329._4_4_ = fVar98 * auVar15._4_4_;
    auVar329._8_4_ = fVar98 * auVar15._8_4_;
    auVar329._12_4_ = fVar98 * auVar15._12_4_;
    auVar15 = vdpps_avx(auVar158,auVar15,0x7f);
    fVar98 = auVar15._0_4_;
    auVar242._0_4_ = fVar98 * auVar158._0_4_;
    auVar242._4_4_ = fVar98 * auVar158._4_4_;
    auVar242._8_4_ = fVar98 * auVar158._8_4_;
    auVar242._12_4_ = fVar98 * auVar158._12_4_;
    auVar21 = vsubps_avx(auVar329,auVar242);
    auVar15 = vrcpss_avx(auVar168,auVar168);
    auVar16 = vfnmadd213ss_fma(auVar16,auVar15,SUB6416(ZEXT464(0x40000000),0));
    fVar147 = auVar15._0_4_ * auVar16._0_4_;
    fVar129 = auVar158._0_4_ * fVar69;
    fVar142 = auVar158._4_4_ * fVar69;
    fVar143 = auVar158._8_4_ * fVar69;
    fVar144 = auVar158._12_4_ * fVar69;
    auVar22 = vpermilps_avx(auVar102,0xc9);
    auVar16 = vdpps_avx(auVar22,auVar22,0x7f);
    auVar15 = vblendps_avx(auVar16,_DAT_01f7aa10,0xe);
    auVar158 = vrsqrtss_avx(auVar15,auVar15);
    fVar70 = auVar16._0_4_;
    fVar98 = auVar158._0_4_;
    auVar23 = vpermilps_avx(auVar103,0xc9);
    auVar158 = vdpps_avx(auVar22,auVar23,0x7f);
    fVar98 = fVar98 * 1.5 + fVar98 * fVar98 * fVar98 * fVar70 * -0.5;
    auVar282._0_4_ = fVar70 * auVar23._0_4_;
    auVar282._4_4_ = fVar70 * auVar23._4_4_;
    auVar282._8_4_ = fVar70 * auVar23._8_4_;
    auVar282._12_4_ = fVar70 * auVar23._12_4_;
    fVar70 = auVar158._0_4_;
    auVar78._0_4_ = fVar70 * auVar22._0_4_;
    auVar78._4_4_ = fVar70 * auVar22._4_4_;
    auVar78._8_4_ = fVar70 * auVar22._8_4_;
    auVar78._12_4_ = fVar70 * auVar22._12_4_;
    auVar158 = vsubps_avx(auVar282,auVar78);
    auVar15 = vrcpss_avx(auVar15,auVar15);
    auVar73 = SUB6416(ZEXT464(0x40000000),0);
    auVar16 = vfnmadd213ss_fma(auVar16,auVar15,auVar73);
    fVar70 = auVar15._0_4_ * auVar16._0_4_;
    fVar145 = auVar22._0_4_ * fVar98;
    fVar165 = auVar22._4_4_ * fVar98;
    fVar166 = auVar22._8_4_ * fVar98;
    fVar167 = auVar22._12_4_ * fVar98;
    auVar15 = vshufps_avx(auVar130,auVar130,0xff);
    auVar16 = vshufps_avx(auVar24,auVar24,0xff);
    auVar243._0_4_ = auVar16._0_4_ * fVar129;
    auVar243._4_4_ = auVar16._4_4_ * fVar142;
    auVar243._8_4_ = auVar16._8_4_ * fVar143;
    auVar243._12_4_ = auVar16._12_4_ * fVar144;
    auVar169._0_4_ = auVar15._0_4_ * fVar129 + fVar69 * auVar21._0_4_ * fVar147 * auVar16._0_4_;
    auVar169._4_4_ = auVar15._4_4_ * fVar142 + fVar69 * auVar21._4_4_ * fVar147 * auVar16._4_4_;
    auVar169._8_4_ = auVar15._8_4_ * fVar143 + fVar69 * auVar21._8_4_ * fVar147 * auVar16._8_4_;
    auVar169._12_4_ = auVar15._12_4_ * fVar144 + fVar69 * auVar21._12_4_ * fVar147 * auVar16._12_4_;
    auVar21 = vsubps_avx(auVar24,auVar243);
    local_6d0._0_4_ = auVar243._0_4_ + auVar24._0_4_;
    local_6d0._4_4_ = auVar243._4_4_ + auVar24._4_4_;
    fStack_6c8 = auVar243._8_4_ + auVar24._8_4_;
    fStack_6c4 = auVar243._12_4_ + auVar24._12_4_;
    auVar22 = vsubps_avx(auVar130,auVar169);
    auVar15 = vshufps_avx(auVar131,auVar131,0xff);
    auVar16 = vshufps_avx(auVar328,auVar328,0xff);
    auVar150._0_4_ = auVar16._0_4_ * fVar145;
    auVar150._4_4_ = auVar16._4_4_ * fVar165;
    auVar150._8_4_ = auVar16._8_4_ * fVar166;
    auVar150._12_4_ = auVar16._12_4_ * fVar167;
    auVar170._0_4_ = auVar15._0_4_ * fVar145 + auVar16._0_4_ * fVar98 * auVar158._0_4_ * fVar70;
    auVar170._4_4_ = auVar15._4_4_ * fVar165 + auVar16._4_4_ * fVar98 * auVar158._4_4_ * fVar70;
    auVar170._8_4_ = auVar15._8_4_ * fVar166 + auVar16._8_4_ * fVar98 * auVar158._8_4_ * fVar70;
    auVar170._12_4_ = auVar15._12_4_ * fVar167 + auVar16._12_4_ * fVar98 * auVar158._12_4_ * fVar70;
    auVar158 = vsubps_avx(auVar328,auVar150);
    local_660._4_4_ = auVar328._4_4_ + auVar150._4_4_;
    local_660._0_4_ = auVar328._0_4_ + auVar150._0_4_;
    fStack_658 = auVar328._8_4_ + auVar150._8_4_;
    fStack_654 = auVar328._12_4_ + auVar150._12_4_;
    auVar23 = vsubps_avx(auVar131,auVar170);
    auVar79._8_4_ = 0x3e2aaaab;
    auVar79._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar79._12_4_ = 0x3e2aaaab;
    local_6a0 = auVar57._0_4_;
    fStack_69c = auVar57._4_4_;
    fStack_698 = auVar57._8_4_;
    auVar303._0_4_ = local_6a0 * 0.16666667;
    auVar303._4_4_ = fStack_69c * 0.16666667;
    auVar303._8_4_ = fStack_698 * 0.16666667;
    auVar303._12_4_ = fVar146 * 0.16666667;
    auVar151._8_4_ = 0x3f2aaaab;
    auVar151._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar151._12_4_ = 0x3f2aaaab;
    auVar15 = vfmadd231ps_fma(auVar303,auVar151,auVar18);
    auVar16 = vfmadd231ps_fma(auVar74,auVar19,auVar151);
    auVar18 = vfmadd231ps_fma(auVar15,auVar19,auVar79);
    auVar24 = vfmadd231ps_fma(auVar16,auVar20,auVar79);
    auVar19 = vpermilps_avx(auVar104,0xc9);
    auVar15 = vdpps_avx(auVar19,auVar19,0x7f);
    auVar328 = vfmadd231ps_fma(auVar18,auVar20,ZEXT816(0) << 0x40);
    fVar98 = auVar15._0_4_;
    auVar171._4_12_ = ZEXT812(0) << 0x20;
    auVar171._0_4_ = fVar98;
    auVar16 = vrsqrtss_avx(auVar171,auVar171);
    fVar69 = auVar16._0_4_;
    fVar69 = fVar98 * -0.5 * fVar69 * fVar69 * fVar69 + fVar69 * 1.5;
    auVar16 = vpermilps_avx(auVar245,0xc9);
    auVar271._0_4_ = fVar98 * auVar16._0_4_;
    auVar271._4_4_ = fVar98 * auVar16._4_4_;
    auVar271._8_4_ = fVar98 * auVar16._8_4_;
    auVar271._12_4_ = fVar98 * auVar16._12_4_;
    auVar16 = vdpps_avx(auVar19,auVar16,0x7f);
    fVar98 = auVar16._0_4_;
    auVar244._0_4_ = fVar98 * auVar19._0_4_;
    auVar244._4_4_ = fVar98 * auVar19._4_4_;
    auVar244._8_4_ = fVar98 * auVar19._8_4_;
    auVar244._12_4_ = fVar98 * auVar19._12_4_;
    auVar18 = vsubps_avx(auVar271,auVar244);
    auVar16 = vrcpss_avx(auVar171,auVar171);
    auVar15 = vfnmadd213ss_fma(auVar15,auVar16,auVar73);
    fVar147 = auVar16._0_4_ * auVar15._0_4_;
    fVar146 = auVar19._0_4_ * fVar69;
    fVar129 = auVar19._4_4_ * fVar69;
    fVar142 = auVar19._8_4_ * fVar69;
    fVar143 = auVar19._12_4_ * fVar69;
    auVar20 = vpermilps_avx(auVar110,0xc9);
    auVar15 = vdpps_avx(auVar20,auVar20,0x7f);
    fVar70 = auVar15._0_4_;
    auVar245 = ZEXT416((uint)fVar70);
    auVar16 = vrsqrtss_avx(auVar245,auVar245);
    fVar98 = auVar16._0_4_;
    auVar19 = vpermilps_avx(auVar287,0xc9);
    auVar16 = vdpps_avx(auVar20,auVar19,0x7f);
    fVar98 = fVar98 * 1.5 + fVar70 * -0.5 * fVar98 * fVar98 * fVar98;
    auVar283._0_4_ = fVar70 * auVar19._0_4_;
    auVar283._4_4_ = fVar70 * auVar19._4_4_;
    auVar283._8_4_ = fVar70 * auVar19._8_4_;
    auVar283._12_4_ = fVar70 * auVar19._12_4_;
    fVar70 = auVar16._0_4_;
    auVar317._0_4_ = fVar70 * auVar20._0_4_;
    auVar317._4_4_ = fVar70 * auVar20._4_4_;
    auVar317._8_4_ = fVar70 * auVar20._8_4_;
    auVar317._12_4_ = fVar70 * auVar20._12_4_;
    auVar19 = vsubps_avx(auVar283,auVar317);
    auVar16 = vrcpss_avx(auVar245,auVar245);
    auVar15 = vfnmadd213ss_fma(auVar15,auVar16,auVar73);
    fVar70 = auVar16._0_4_ * auVar15._0_4_;
    fVar144 = fVar98 * auVar20._0_4_;
    fVar145 = fVar98 * auVar20._4_4_;
    fVar165 = fVar98 * auVar20._8_4_;
    fVar166 = fVar98 * auVar20._12_4_;
    auVar15 = vshufps_avx(auVar155,auVar155,0xff);
    auVar16 = vshufps_avx(auVar24,auVar24,0xff);
    auVar152._0_4_ = auVar16._0_4_ * fVar146;
    auVar152._4_4_ = auVar16._4_4_ * fVar129;
    auVar152._8_4_ = auVar16._8_4_ * fVar142;
    auVar152._12_4_ = auVar16._12_4_ * fVar143;
    auVar113._0_4_ = auVar15._0_4_ * fVar146 + auVar16._0_4_ * fVar69 * auVar18._0_4_ * fVar147;
    auVar113._4_4_ = auVar15._4_4_ * fVar129 + auVar16._4_4_ * fVar69 * auVar18._4_4_ * fVar147;
    auVar113._8_4_ = auVar15._8_4_ * fVar142 + auVar16._8_4_ * fVar69 * auVar18._8_4_ * fVar147;
    auVar113._12_4_ = auVar15._12_4_ * fVar143 + auVar16._12_4_ * fVar69 * auVar18._12_4_ * fVar147;
    auVar18 = vsubps_avx(auVar24,auVar152);
    fVar147 = auVar24._0_4_ + auVar152._0_4_;
    fVar146 = auVar24._4_4_ + auVar152._4_4_;
    fVar129 = auVar24._8_4_ + auVar152._8_4_;
    fVar142 = auVar24._12_4_ + auVar152._12_4_;
    auVar20 = vsubps_avx(auVar155,auVar113);
    auVar15 = vshufps_avx(auVar183,auVar183,0xff);
    auVar16 = vshufps_avx(auVar328,auVar328,0xff);
    auVar172._0_4_ = auVar16._0_4_ * fVar144;
    auVar172._4_4_ = auVar16._4_4_ * fVar145;
    auVar172._8_4_ = auVar16._8_4_ * fVar165;
    auVar172._12_4_ = auVar16._12_4_ * fVar166;
    auVar114._0_4_ = auVar16._0_4_ * fVar98 * auVar19._0_4_ * fVar70 + auVar15._0_4_ * fVar144;
    auVar114._4_4_ = auVar16._4_4_ * fVar98 * auVar19._4_4_ * fVar70 + auVar15._4_4_ * fVar145;
    auVar114._8_4_ = auVar16._8_4_ * fVar98 * auVar19._8_4_ * fVar70 + auVar15._8_4_ * fVar165;
    auVar114._12_4_ = auVar16._12_4_ * fVar98 * auVar19._12_4_ * fVar70 + auVar15._12_4_ * fVar166;
    auVar15 = vsubps_avx(auVar328,auVar172);
    auVar173._0_4_ = auVar328._0_4_ + auVar172._0_4_;
    auVar173._4_4_ = auVar328._4_4_ + auVar172._4_4_;
    auVar173._8_4_ = auVar328._8_4_ + auVar172._8_4_;
    auVar173._12_4_ = auVar328._12_4_ + auVar172._12_4_;
    auVar16 = vsubps_avx(auVar183,auVar114);
    local_6c0._0_4_ = auVar22._0_4_;
    local_6c0._4_4_ = auVar22._4_4_;
    uStack_6b8._0_4_ = auVar22._8_4_;
    uStack_6b8._4_4_ = auVar22._12_4_;
    auVar188._0_4_ = auVar21._0_4_ + (float)local_6c0._0_4_ * 0.33333334;
    auVar188._4_4_ = auVar21._4_4_ + (float)local_6c0._4_4_ * 0.33333334;
    auVar188._8_4_ = auVar21._8_4_ + (float)uStack_6b8 * 0.33333334;
    auVar188._12_4_ = auVar21._12_4_ + uStack_6b8._4_4_ * 0.33333334;
    fVar69 = 1.0 - fVar99;
    auVar115._4_4_ = fVar69;
    auVar115._0_4_ = fVar69;
    auVar115._8_4_ = fVar69;
    auVar115._12_4_ = fVar69;
    auVar284._0_4_ = fVar99 * auVar18._0_4_;
    auVar284._4_4_ = fVar99 * auVar18._4_4_;
    auVar284._8_4_ = fVar99 * auVar18._8_4_;
    auVar284._12_4_ = fVar99 * auVar18._12_4_;
    local_4f0 = vfmadd231ps_fma(auVar284,auVar115,auVar21);
    auVar132._0_4_ = fVar99 * (auVar18._0_4_ + auVar20._0_4_ * 0.33333334);
    auVar132._4_4_ = fVar99 * (auVar18._4_4_ + auVar20._4_4_ * 0.33333334);
    auVar132._8_4_ = fVar99 * (auVar18._8_4_ + auVar20._8_4_ * 0.33333334);
    auVar132._12_4_ = fVar99 * (auVar18._12_4_ + auVar20._12_4_ * 0.33333334);
    auVar22 = vfmadd231ps_fma(auVar132,auVar115,auVar188);
    local_760._0_4_ = auVar23._0_4_;
    local_760._4_4_ = auVar23._4_4_;
    uStack_758._0_4_ = auVar23._8_4_;
    uStack_758._4_4_ = auVar23._12_4_;
    auVar133._0_4_ = (float)local_760._0_4_ * 0.33333334;
    auVar133._4_4_ = (float)local_760._4_4_ * 0.33333334;
    auVar133._8_4_ = (float)uStack_758 * 0.33333334;
    auVar133._12_4_ = uStack_758._4_4_ * 0.33333334;
    auVar18 = vsubps_avx(auVar158,auVar133);
    auVar304._0_4_ = (float)local_6d0._0_4_ + (fVar238 + auVar169._0_4_) * 0.33333334;
    auVar304._4_4_ = (float)local_6d0._4_4_ + (fVar255 + auVar169._4_4_) * 0.33333334;
    auVar304._8_4_ = fStack_6c8 + (fVar269 + auVar169._8_4_) * 0.33333334;
    auVar304._12_4_ = fStack_6c4 + (fVar100 + auVar169._12_4_) * 0.33333334;
    auVar206._0_4_ = (fVar313 + auVar170._0_4_) * 0.33333334;
    auVar206._4_4_ = (fVar325 + auVar170._4_4_) * 0.33333334;
    auVar206._8_4_ = (fVar326 + auVar170._8_4_) * 0.33333334;
    auVar206._12_4_ = (fVar327 + auVar170._12_4_) * 0.33333334;
    auVar19 = vsubps_avx(_local_660,auVar206);
    auVar285._0_4_ = auVar16._0_4_ * 0.33333334;
    auVar285._4_4_ = auVar16._4_4_ * 0.33333334;
    auVar285._8_4_ = auVar16._8_4_ * 0.33333334;
    auVar285._12_4_ = auVar16._12_4_ * 0.33333334;
    auVar16 = vsubps_avx(auVar15,auVar285);
    auVar259._0_4_ = (fVar182 + auVar114._0_4_) * 0.33333334;
    auVar259._4_4_ = (fVar202 + auVar114._4_4_) * 0.33333334;
    auVar259._8_4_ = (fVar203 + auVar114._8_4_) * 0.33333334;
    auVar259._12_4_ = (fVar233 + auVar114._12_4_) * 0.33333334;
    auVar20 = vsubps_avx(auVar173,auVar259);
    auVar286._0_4_ = fVar99 * auVar16._0_4_;
    auVar286._4_4_ = fVar99 * auVar16._4_4_;
    auVar286._8_4_ = fVar99 * auVar16._8_4_;
    auVar286._12_4_ = fVar99 * auVar16._12_4_;
    auVar246._0_4_ = fVar99 * auVar15._0_4_;
    auVar246._4_4_ = fVar99 * auVar15._4_4_;
    auVar246._8_4_ = fVar99 * auVar15._8_4_;
    auVar246._12_4_ = fVar99 * auVar15._12_4_;
    local_500 = vfmadd231ps_fma(auVar286,auVar115,auVar18);
    auVar23 = vfmadd231ps_fma(auVar246,auVar115,auVar158);
    auVar134._0_4_ = fVar99 * fVar147;
    auVar134._4_4_ = fVar99 * fVar146;
    auVar134._8_4_ = fVar99 * fVar129;
    auVar134._12_4_ = fVar99 * fVar142;
    auVar153._0_4_ = fVar99 * (fVar147 + (fVar234 + auVar113._0_4_) * 0.33333334);
    auVar153._4_4_ = fVar99 * (fVar146 + (fVar235 + auVar113._4_4_) * 0.33333334);
    auVar153._8_4_ = fVar99 * (fVar129 + (fVar236 + auVar113._8_4_) * 0.33333334);
    auVar153._12_4_ = fVar99 * (fVar142 + (fVar237 + auVar113._12_4_) * 0.33333334);
    auVar224._0_4_ = fVar99 * auVar20._0_4_;
    auVar224._4_4_ = fVar99 * auVar20._4_4_;
    auVar224._8_4_ = fVar99 * auVar20._8_4_;
    auVar224._12_4_ = fVar99 * auVar20._12_4_;
    auVar174._0_4_ = fVar99 * auVar173._0_4_;
    auVar174._4_4_ = fVar99 * auVar173._4_4_;
    auVar174._8_4_ = fVar99 * auVar173._8_4_;
    auVar174._12_4_ = fVar99 * auVar173._12_4_;
    _local_510 = vfmadd231ps_fma(auVar134,auVar115,_local_6d0);
    _local_520 = vfmadd231ps_fma(auVar153,auVar115,auVar304);
    auVar24 = vfmadd231ps_fma(auVar224,auVar115,auVar19);
    auVar328 = vfmadd231ps_fma(auVar174,auVar115,_local_660);
    auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    local_4d0 = vsubps_avx(local_4f0,auVar15);
    auVar16 = vshufps_avx(local_4d0,local_4d0,0x55);
    auVar158 = vshufps_avx(local_4d0,local_4d0,0xaa);
    aVar5 = pre->ray_space[k].vy.field_0;
    fVar69 = pre->ray_space[k].vz.field_0.m128[0];
    fVar98 = pre->ray_space[k].vz.field_0.m128[1];
    fVar99 = pre->ray_space[k].vz.field_0.m128[2];
    fVar147 = pre->ray_space[k].vz.field_0.m128[3];
    auVar80._0_4_ = fVar69 * auVar158._0_4_;
    auVar80._4_4_ = fVar98 * auVar158._4_4_;
    auVar80._8_4_ = fVar99 * auVar158._8_4_;
    auVar80._12_4_ = fVar147 * auVar158._12_4_;
    auVar18 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar16);
    local_4e0 = vsubps_avx(auVar22,auVar15);
    auVar16 = vshufps_avx(local_4e0,local_4e0,0x55);
    auVar158 = vshufps_avx(local_4e0,local_4e0,0xaa);
    auVar330._0_4_ = fVar69 * auVar158._0_4_;
    auVar330._4_4_ = fVar98 * auVar158._4_4_;
    auVar330._8_4_ = fVar99 * auVar158._8_4_;
    auVar330._12_4_ = fVar147 * auVar158._12_4_;
    auVar158 = vfmadd231ps_fma(auVar330,(undefined1  [16])aVar5,auVar16);
    local_3c0 = vsubps_avx(local_500,auVar15);
    auVar16 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar305._0_4_ = fVar69 * auVar16._0_4_;
    auVar305._4_4_ = fVar98 * auVar16._4_4_;
    auVar305._8_4_ = fVar99 * auVar16._8_4_;
    auVar305._12_4_ = fVar147 * auVar16._12_4_;
    auVar16 = vshufps_avx(local_3c0,local_3c0,0x55);
    auVar19 = vfmadd231ps_fma(auVar305,(undefined1  [16])aVar5,auVar16);
    local_3d0 = vsubps_avx(auVar23,auVar15);
    auVar16 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar318._0_4_ = fVar69 * auVar16._0_4_;
    auVar318._4_4_ = fVar98 * auVar16._4_4_;
    auVar318._8_4_ = fVar99 * auVar16._8_4_;
    auVar318._12_4_ = fVar147 * auVar16._12_4_;
    auVar16 = vshufps_avx(local_3d0,local_3d0,0x55);
    auVar20 = vfmadd231ps_fma(auVar318,(undefined1  [16])aVar5,auVar16);
    local_3e0 = vsubps_avx(_local_510,auVar15);
    auVar16 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar175._0_4_ = fVar69 * auVar16._0_4_;
    auVar175._4_4_ = fVar98 * auVar16._4_4_;
    auVar175._8_4_ = fVar99 * auVar16._8_4_;
    auVar175._12_4_ = fVar147 * auVar16._12_4_;
    auVar16 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar21 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar5,auVar16);
    local_3f0 = vsubps_avx(_local_520,auVar15);
    auVar16 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar225._0_4_ = fVar69 * auVar16._0_4_;
    auVar225._4_4_ = fVar98 * auVar16._4_4_;
    auVar225._8_4_ = fVar99 * auVar16._8_4_;
    auVar225._12_4_ = fVar147 * auVar16._12_4_;
    auVar16 = vshufps_avx(local_3f0,local_3f0,0x55);
    auVar245 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar16);
    local_400 = vsubps_avx(auVar24,auVar15);
    auVar16 = vshufps_avx(local_400,local_400,0xaa);
    auVar260._0_4_ = fVar69 * auVar16._0_4_;
    auVar260._4_4_ = fVar98 * auVar16._4_4_;
    auVar260._8_4_ = fVar99 * auVar16._8_4_;
    auVar260._12_4_ = fVar147 * auVar16._12_4_;
    auVar16 = vshufps_avx(local_400,local_400,0x55);
    auVar16 = vfmadd231ps_fma(auVar260,(undefined1  [16])aVar5,auVar16);
    local_410 = vsubps_avx(auVar328,auVar15);
    auVar15 = vshufps_avx(local_410,local_410,0xaa);
    auVar189._0_4_ = fVar69 * auVar15._0_4_;
    auVar189._4_4_ = fVar98 * auVar15._4_4_;
    auVar189._8_4_ = fVar99 * auVar15._8_4_;
    auVar189._12_4_ = fVar147 * auVar15._12_4_;
    auVar15 = vshufps_avx(local_410,local_410,0x55);
    auVar15 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar5,auVar15);
    auVar207._4_4_ = local_4d0._0_4_;
    auVar207._0_4_ = local_4d0._0_4_;
    auVar207._8_4_ = local_4d0._0_4_;
    auVar207._12_4_ = local_4d0._0_4_;
    aVar5 = pre->ray_space[k].vx.field_0;
    auVar73 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar207);
    auVar208._4_4_ = local_4e0._0_4_;
    auVar208._0_4_ = local_4e0._0_4_;
    auVar208._8_4_ = local_4e0._0_4_;
    auVar208._12_4_ = local_4e0._0_4_;
    auVar74 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar5,auVar208);
    uVar71 = local_3c0._0_4_;
    auVar209._4_4_ = uVar71;
    auVar209._0_4_ = uVar71;
    auVar209._8_4_ = uVar71;
    auVar209._12_4_ = uVar71;
    auVar293 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar209);
    uVar71 = local_3d0._0_4_;
    auVar210._4_4_ = uVar71;
    auVar210._0_4_ = uVar71;
    auVar210._8_4_ = uVar71;
    auVar210._12_4_ = uVar71;
    auVar72 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar5,auVar210);
    uVar71 = local_3e0._0_4_;
    auVar211._4_4_ = uVar71;
    auVar211._0_4_ = uVar71;
    auVar211._8_4_ = uVar71;
    auVar211._12_4_ = uVar71;
    auVar102 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar5,auVar211);
    uVar71 = local_3f0._0_4_;
    auVar212._4_4_ = uVar71;
    auVar212._0_4_ = uVar71;
    auVar212._8_4_ = uVar71;
    auVar212._12_4_ = uVar71;
    auVar245 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar5,auVar212);
    uVar71 = local_400._0_4_;
    auVar213._4_4_ = uVar71;
    auVar213._0_4_ = uVar71;
    auVar213._8_4_ = uVar71;
    auVar213._12_4_ = uVar71;
    auVar103 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar213);
    uVar71 = local_410._0_4_;
    auVar214._4_4_ = uVar71;
    auVar214._0_4_ = uVar71;
    auVar214._8_4_ = uVar71;
    auVar214._12_4_ = uVar71;
    auVar104 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar214);
    auVar18 = vmovlhps_avx(auVar73,auVar102);
    auVar19 = vmovlhps_avx(auVar74,auVar245);
    auVar20 = vmovlhps_avx(auVar293,auVar103);
    auVar21 = vmovlhps_avx(auVar72,auVar104);
    auVar15 = vminps_avx(auVar18,auVar19);
    auVar16 = vminps_avx(auVar20,auVar21);
    auVar158 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar18,auVar19);
    auVar16 = vmaxps_avx(auVar20,auVar21);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar16 = vshufpd_avx(auVar158,auVar158,3);
    auVar158 = vminps_avx(auVar158,auVar16);
    auVar16 = vshufpd_avx(auVar15,auVar15,3);
    auVar16 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vandps_avx(local_4c0,auVar158);
    auVar16 = vandps_avx(auVar16,local_4c0);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar16 = vmovshdup_avx(auVar15);
    auVar15 = vmaxss_avx(auVar16,auVar15);
    local_588 = uVar58 + 0xf;
    fVar98 = auVar15._0_4_ * 9.536743e-07;
    auVar247._8_8_ = auVar73._0_8_;
    auVar247._0_8_ = auVar73._0_8_;
    auVar272._8_8_ = auVar74._0_8_;
    auVar272._0_8_ = auVar74._0_8_;
    auVar306._0_8_ = auVar293._0_8_;
    auVar306._8_8_ = auVar306._0_8_;
    auVar319._0_8_ = auVar72._0_8_;
    auVar319._8_8_ = auVar319._0_8_;
    local_380 = fVar98;
    fStack_37c = fVar98;
    fStack_378 = fVar98;
    fStack_374 = fVar98;
    fStack_370 = fVar98;
    fStack_36c = fVar98;
    fStack_368 = fVar98;
    fStack_364 = fVar98;
    local_1c0 = -fVar98;
    fStack_1bc = local_1c0;
    fStack_1b8 = local_1c0;
    fStack_1b4 = local_1c0;
    fStack_1b0 = local_1c0;
    fStack_1ac = local_1c0;
    fStack_1a8 = local_1c0;
    fStack_1a4 = local_1c0;
    local_300 = uVar60;
    uStack_2fc = uVar60;
    uStack_2f8 = uVar60;
    uStack_2f4 = uVar60;
    uStack_2f0 = uVar60;
    uStack_2ec = uVar60;
    uStack_2e8 = uVar60;
    uStack_2e4 = uVar60;
    local_320 = uVar7;
    uStack_31c = uVar7;
    uStack_318 = uVar7;
    uStack_314 = uVar7;
    uStack_310 = uVar7;
    uStack_30c = uVar7;
    uStack_308 = uVar7;
    uStack_304 = uVar7;
    uVar68 = 0;
    fVar69 = *(float *)(ray + k * 4 + 0x60);
    local_390 = vsubps_avx(auVar19,auVar18);
    local_3a0 = vsubps_avx(auVar20,auVar19);
    local_3b0 = vsubps_avx(auVar21,auVar20);
    local_430 = vsubps_avx(_local_510,local_4f0);
    local_440 = vsubps_avx(_local_520,auVar22);
    local_450 = vsubps_avx(auVar24,local_500);
    _local_460 = vsubps_avx(auVar328,auVar23);
    auVar201 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar291 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_016df388:
    local_420 = auVar291._0_16_;
    auVar190 = auVar201._0_16_;
    auVar15 = vshufps_avx(auVar190,auVar190,0x50);
    auVar331._8_4_ = 0x3f800000;
    auVar331._0_8_ = 0x3f8000003f800000;
    auVar331._12_4_ = 0x3f800000;
    auVar334._16_4_ = 0x3f800000;
    auVar334._0_16_ = auVar331;
    auVar334._20_4_ = 0x3f800000;
    auVar334._24_4_ = 0x3f800000;
    auVar334._28_4_ = 0x3f800000;
    auVar16 = vsubps_avx(auVar331,auVar15);
    fVar99 = auVar15._0_4_;
    fVar145 = auVar102._0_4_;
    auVar81._0_4_ = fVar145 * fVar99;
    fVar147 = auVar15._4_4_;
    fVar165 = auVar102._4_4_;
    auVar81._4_4_ = fVar165 * fVar147;
    fVar70 = auVar15._8_4_;
    auVar81._8_4_ = fVar145 * fVar70;
    fVar146 = auVar15._12_4_;
    auVar81._12_4_ = fVar165 * fVar146;
    fVar166 = auVar245._0_4_;
    auVar215._0_4_ = fVar166 * fVar99;
    fVar182 = auVar245._4_4_;
    auVar215._4_4_ = fVar182 * fVar147;
    auVar215._8_4_ = fVar166 * fVar70;
    auVar215._12_4_ = fVar182 * fVar146;
    fVar202 = auVar103._0_4_;
    auVar176._0_4_ = fVar202 * fVar99;
    fVar203 = auVar103._4_4_;
    auVar176._4_4_ = fVar203 * fVar147;
    auVar176._8_4_ = fVar202 * fVar70;
    auVar176._12_4_ = fVar203 * fVar146;
    fVar255 = auVar104._0_4_;
    auVar135._0_4_ = fVar255 * fVar99;
    fVar269 = auVar104._4_4_;
    auVar135._4_4_ = fVar269 * fVar147;
    auVar135._8_4_ = fVar255 * fVar70;
    auVar135._12_4_ = fVar269 * fVar146;
    auVar74 = vfmadd231ps_fma(auVar81,auVar16,auVar247);
    auVar293 = vfmadd231ps_fma(auVar215,auVar16,auVar272);
    auVar72 = vfmadd231ps_fma(auVar176,auVar16,auVar306);
    auVar110 = vfmadd231ps_fma(auVar135,auVar319,auVar16);
    auVar15 = vmovshdup_avx(auVar291._0_16_);
    fVar99 = auVar291._0_4_;
    fStack_268 = (auVar15._0_4_ - fVar99) * 0.04761905;
    auVar268._4_4_ = fVar99;
    auVar268._0_4_ = fVar99;
    auVar268._8_4_ = fVar99;
    auVar268._12_4_ = fVar99;
    auVar268._16_4_ = fVar99;
    auVar268._20_4_ = fVar99;
    auVar268._24_4_ = fVar99;
    auVar268._28_4_ = fVar99;
    auVar125._0_8_ = auVar15._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar125._16_8_ = auVar125._0_8_;
    auVar125._24_8_ = auVar125._0_8_;
    auVar93 = vsubps_avx(auVar125,auVar268);
    uVar71 = auVar74._0_4_;
    auVar323._4_4_ = uVar71;
    auVar323._0_4_ = uVar71;
    auVar323._8_4_ = uVar71;
    auVar323._12_4_ = uVar71;
    auVar323._16_4_ = uVar71;
    auVar323._20_4_ = uVar71;
    auVar323._24_4_ = uVar71;
    auVar323._28_4_ = uVar71;
    auVar15 = vmovshdup_avx(auVar74);
    uVar101 = auVar15._0_8_;
    auVar312._8_8_ = uVar101;
    auVar312._0_8_ = uVar101;
    auVar312._16_8_ = uVar101;
    auVar312._24_8_ = uVar101;
    fVar167 = auVar293._0_4_;
    auVar299._4_4_ = fVar167;
    auVar299._0_4_ = fVar167;
    auVar299._8_4_ = fVar167;
    auVar299._12_4_ = fVar167;
    auVar299._16_4_ = fVar167;
    auVar299._20_4_ = fVar167;
    auVar299._24_4_ = fVar167;
    auVar299._28_4_ = fVar167;
    auVar16 = vmovshdup_avx(auVar293);
    auVar126._0_8_ = auVar16._0_8_;
    auVar126._8_8_ = auVar126._0_8_;
    auVar126._16_8_ = auVar126._0_8_;
    auVar126._24_8_ = auVar126._0_8_;
    fVar144 = auVar72._0_4_;
    auVar230._4_4_ = fVar144;
    auVar230._0_4_ = fVar144;
    auVar230._8_4_ = fVar144;
    auVar230._12_4_ = fVar144;
    auVar230._16_4_ = fVar144;
    auVar230._20_4_ = fVar144;
    auVar230._24_4_ = fVar144;
    auVar230._28_4_ = fVar144;
    auVar158 = vmovshdup_avx(auVar72);
    auVar253._0_8_ = auVar158._0_8_;
    auVar253._8_8_ = auVar253._0_8_;
    auVar253._16_8_ = auVar253._0_8_;
    auVar253._24_8_ = auVar253._0_8_;
    fVar143 = auVar110._0_4_;
    auVar73 = vmovshdup_avx(auVar110);
    auVar287 = vfmadd132ps_fma(auVar93,auVar268,_DAT_01faff20);
    auVar93 = vsubps_avx(auVar334,ZEXT1632(auVar287));
    fVar99 = auVar287._0_4_;
    fVar147 = auVar287._4_4_;
    auVar26._4_4_ = fVar167 * fVar147;
    auVar26._0_4_ = fVar167 * fVar99;
    fVar70 = auVar287._8_4_;
    auVar26._8_4_ = fVar167 * fVar70;
    fVar146 = auVar287._12_4_;
    auVar26._12_4_ = fVar167 * fVar146;
    auVar26._16_4_ = fVar167 * 0.0;
    auVar26._20_4_ = fVar167 * 0.0;
    auVar26._24_4_ = fVar167 * 0.0;
    auVar26._28_4_ = 0x3f800000;
    auVar287 = vfmadd231ps_fma(auVar26,auVar93,auVar323);
    fVar129 = auVar16._0_4_;
    fVar142 = auVar16._4_4_;
    auVar25._4_4_ = fVar142 * fVar147;
    auVar25._0_4_ = fVar129 * fVar99;
    auVar25._8_4_ = fVar129 * fVar70;
    auVar25._12_4_ = fVar142 * fVar146;
    auVar25._16_4_ = fVar129 * 0.0;
    auVar25._20_4_ = fVar142 * 0.0;
    auVar25._24_4_ = fVar129 * 0.0;
    auVar25._28_4_ = uVar71;
    auVar130 = vfmadd231ps_fma(auVar25,auVar93,auVar312);
    auVar17._4_4_ = fVar144 * fVar147;
    auVar17._0_4_ = fVar144 * fVar99;
    auVar17._8_4_ = fVar144 * fVar70;
    auVar17._12_4_ = fVar144 * fVar146;
    auVar17._16_4_ = fVar144 * 0.0;
    auVar17._20_4_ = fVar144 * 0.0;
    auVar17._24_4_ = fVar144 * 0.0;
    auVar17._28_4_ = auVar15._4_4_;
    auVar131 = vfmadd231ps_fma(auVar17,auVar93,auVar299);
    fVar129 = auVar158._0_4_;
    fVar142 = auVar158._4_4_;
    auVar27._4_4_ = fVar142 * fVar147;
    auVar27._0_4_ = fVar129 * fVar99;
    auVar27._8_4_ = fVar129 * fVar70;
    auVar27._12_4_ = fVar142 * fVar146;
    auVar27._16_4_ = fVar129 * 0.0;
    auVar27._20_4_ = fVar142 * 0.0;
    auVar27._24_4_ = fVar129 * 0.0;
    auVar27._28_4_ = fVar167;
    auVar155 = vfmadd231ps_fma(auVar27,auVar93,auVar126);
    auVar15 = vshufps_avx(auVar74,auVar74,0xaa);
    uStack_6b8 = auVar15._0_8_;
    local_6c0 = (undefined1  [8])uStack_6b8;
    uStack_6b0 = uStack_6b8;
    uStack_6a8 = uStack_6b8;
    auVar16 = vshufps_avx(auVar74,auVar74,0xff);
    uStack_758 = auVar16._0_8_;
    local_760 = (undefined1  [8])uStack_758;
    uStack_750 = uStack_758;
    uStack_748 = uStack_758;
    auVar28._4_4_ = fVar143 * fVar147;
    auVar28._0_4_ = fVar143 * fVar99;
    auVar28._8_4_ = fVar143 * fVar70;
    auVar28._12_4_ = fVar143 * fVar146;
    auVar28._16_4_ = fVar143 * 0.0;
    auVar28._20_4_ = fVar143 * 0.0;
    auVar28._24_4_ = fVar143 * 0.0;
    auVar28._28_4_ = fVar143;
    auVar74 = vfmadd231ps_fma(auVar28,auVar93,auVar230);
    auVar16 = vshufps_avx(auVar293,auVar293,0xaa);
    auVar231._0_8_ = auVar16._0_8_;
    auVar231._8_8_ = auVar231._0_8_;
    auVar231._16_8_ = auVar231._0_8_;
    auVar231._24_8_ = auVar231._0_8_;
    auVar158 = vshufps_avx(auVar293,auVar293,0xff);
    local_640._8_8_ = auVar158._0_8_;
    local_640._0_8_ = local_640._8_8_;
    local_640._16_8_ = local_640._8_8_;
    local_640._24_8_ = local_640._8_8_;
    fVar129 = auVar73._0_4_;
    fVar142 = auVar73._4_4_;
    auVar29._4_4_ = fVar142 * fVar147;
    auVar29._0_4_ = fVar129 * fVar99;
    auVar29._8_4_ = fVar129 * fVar70;
    auVar29._12_4_ = fVar142 * fVar146;
    auVar29._16_4_ = fVar129 * 0.0;
    auVar29._20_4_ = fVar142 * 0.0;
    auVar29._24_4_ = fVar129 * 0.0;
    auVar29._28_4_ = auVar15._4_4_;
    auVar183 = vfmadd231ps_fma(auVar29,auVar93,auVar253);
    auVar30._28_4_ = fVar142;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar131._12_4_ * fVar146,
                            CONCAT48(auVar131._8_4_ * fVar70,
                                     CONCAT44(auVar131._4_4_ * fVar147,auVar131._0_4_ * fVar99))));
    auVar287 = vfmadd231ps_fma(auVar30,auVar93,ZEXT1632(auVar287));
    fVar129 = auVar158._4_4_;
    auVar31._28_4_ = fVar129;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar155._12_4_ * fVar146,
                            CONCAT48(auVar155._8_4_ * fVar70,
                                     CONCAT44(auVar155._4_4_ * fVar147,auVar155._0_4_ * fVar99))));
    auVar130 = vfmadd231ps_fma(auVar31,auVar93,ZEXT1632(auVar130));
    auVar15 = vshufps_avx(auVar72,auVar72,0xaa);
    uVar101 = auVar15._0_8_;
    auVar220._8_8_ = uVar101;
    auVar220._0_8_ = uVar101;
    auVar220._16_8_ = uVar101;
    auVar220._24_8_ = uVar101;
    auVar73 = vshufps_avx(auVar72,auVar72,0xff);
    uVar101 = auVar73._0_8_;
    auVar335._8_8_ = uVar101;
    auVar335._0_8_ = uVar101;
    auVar335._16_8_ = uVar101;
    auVar335._24_8_ = uVar101;
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar74._12_4_ * fVar146,
                                                 CONCAT48(auVar74._8_4_ * fVar70,
                                                          CONCAT44(auVar74._4_4_ * fVar147,
                                                                   auVar74._0_4_ * fVar99)))),
                              auVar93,ZEXT1632(auVar131));
    auVar74 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar293 = vshufps_avx(auVar110,auVar110,0xff);
    auVar110 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar183._12_4_,
                                                  CONCAT48(fVar70 * auVar183._8_4_,
                                                           CONCAT44(fVar147 * auVar183._4_4_,
                                                                    fVar99 * auVar183._0_4_)))),
                               auVar93,ZEXT1632(auVar155));
    auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar72._12_4_,
                                                  CONCAT48(fVar70 * auVar72._8_4_,
                                                           CONCAT44(fVar147 * auVar72._4_4_,
                                                                    fVar99 * auVar72._0_4_)))),
                               auVar93,ZEXT1632(auVar287));
    auVar26 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar287));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar110._12_4_,
                                                 CONCAT48(fVar70 * auVar110._8_4_,
                                                          CONCAT44(fVar147 * auVar110._4_4_,
                                                                   fVar99 * auVar110._0_4_)))),
                              auVar93,ZEXT1632(auVar130));
    auVar94 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar130));
    fStack_5e4 = auVar94._28_4_;
    auVar300._0_4_ = fStack_268 * auVar26._0_4_ * 3.0;
    auVar300._4_4_ = fStack_268 * auVar26._4_4_ * 3.0;
    auVar300._8_4_ = fStack_268 * auVar26._8_4_ * 3.0;
    auVar300._12_4_ = fStack_268 * auVar26._12_4_ * 3.0;
    auVar300._16_4_ = fStack_268 * auVar26._16_4_ * 3.0;
    auVar300._20_4_ = fStack_268 * auVar26._20_4_ * 3.0;
    auVar300._24_4_ = fStack_268 * auVar26._24_4_ * 3.0;
    auVar300._28_4_ = 0;
    local_600._0_4_ = fStack_268 * auVar94._0_4_ * 3.0;
    local_600._4_4_ = fStack_268 * auVar94._4_4_ * 3.0;
    fStack_5f8 = fStack_268 * auVar94._8_4_ * 3.0;
    fStack_5f4 = fStack_268 * auVar94._12_4_ * 3.0;
    fStack_5f0 = fStack_268 * auVar94._16_4_ * 3.0;
    fStack_5ec = fStack_268 * auVar94._20_4_ * 3.0;
    fStack_5e8 = fStack_268 * auVar94._24_4_ * 3.0;
    fVar142 = auVar16._0_4_;
    fVar143 = auVar16._4_4_;
    auVar301._4_4_ = fVar143 * fVar147;
    auVar301._0_4_ = fVar142 * fVar99;
    auVar301._8_4_ = fVar142 * fVar70;
    auVar301._12_4_ = fVar143 * fVar146;
    auVar301._16_4_ = fVar142 * 0.0;
    auVar301._20_4_ = fVar143 * 0.0;
    auVar301._24_4_ = fVar142 * 0.0;
    auVar301._28_4_ = fStack_5e4;
    auVar16 = vfmadd231ps_fma(auVar301,auVar93,_local_6c0);
    fVar142 = auVar158._0_4_;
    auVar32._4_4_ = fVar129 * fVar147;
    auVar32._0_4_ = fVar142 * fVar99;
    auVar32._8_4_ = fVar142 * fVar70;
    auVar32._12_4_ = fVar129 * fVar146;
    auVar32._16_4_ = fVar142 * 0.0;
    auVar32._20_4_ = fVar129 * 0.0;
    auVar32._24_4_ = fVar142 * 0.0;
    auVar32._28_4_ = 0;
    auVar158 = vfmadd231ps_fma(auVar32,auVar93,_local_760);
    fVar129 = auVar15._0_4_;
    fVar142 = auVar15._4_4_;
    auVar33._4_4_ = fVar142 * fVar147;
    auVar33._0_4_ = fVar129 * fVar99;
    auVar33._8_4_ = fVar129 * fVar70;
    auVar33._12_4_ = fVar142 * fVar146;
    auVar33._16_4_ = fVar129 * 0.0;
    auVar33._20_4_ = fVar142 * 0.0;
    auVar33._24_4_ = fVar129 * 0.0;
    auVar33._28_4_ = auVar26._28_4_;
    auVar15 = vfmadd231ps_fma(auVar33,auVar93,auVar231);
    fVar129 = auVar73._0_4_;
    fVar144 = auVar73._4_4_;
    auVar34._4_4_ = fVar144 * fVar147;
    auVar34._0_4_ = fVar129 * fVar99;
    auVar34._8_4_ = fVar129 * fVar70;
    auVar34._12_4_ = fVar144 * fVar146;
    auVar34._16_4_ = fVar129 * 0.0;
    auVar34._20_4_ = fVar144 * 0.0;
    auVar34._24_4_ = fVar129 * 0.0;
    auVar34._28_4_ = fVar143;
    auVar73 = vfmadd231ps_fma(auVar34,auVar93,local_640);
    auVar27 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar131));
    fVar129 = auVar74._0_4_;
    fVar142 = auVar74._4_4_;
    auVar35._4_4_ = fVar142 * fVar147;
    auVar35._0_4_ = fVar129 * fVar99;
    auVar35._8_4_ = fVar129 * fVar70;
    auVar35._12_4_ = fVar142 * fVar146;
    auVar35._16_4_ = fVar129 * 0.0;
    auVar35._20_4_ = fVar142 * 0.0;
    auVar35._24_4_ = fVar129 * 0.0;
    auVar35._28_4_ = fVar142;
    auVar74 = vfmadd231ps_fma(auVar35,auVar93,auVar220);
    auVar28 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar72));
    fVar129 = auVar293._0_4_;
    fVar142 = auVar293._4_4_;
    auVar36._4_4_ = fVar142 * fVar147;
    auVar36._0_4_ = fVar129 * fVar99;
    auVar36._8_4_ = fVar129 * fVar70;
    auVar36._12_4_ = fVar142 * fVar146;
    auVar36._16_4_ = fVar129 * 0.0;
    auVar36._20_4_ = fVar142 * 0.0;
    auVar36._24_4_ = fVar129 * 0.0;
    auVar36._28_4_ = fVar142;
    auVar293 = vfmadd231ps_fma(auVar36,auVar93,auVar335);
    auVar37._28_4_ = fVar144;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(auVar15._12_4_ * fVar146,
                            CONCAT48(auVar15._8_4_ * fVar70,
                                     CONCAT44(auVar15._4_4_ * fVar147,auVar15._0_4_ * fVar99))));
    auVar16 = vfmadd231ps_fma(auVar37,auVar93,ZEXT1632(auVar16));
    auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar73._12_4_,
                                                  CONCAT48(fVar70 * auVar73._8_4_,
                                                           CONCAT44(fVar147 * auVar73._4_4_,
                                                                    fVar99 * auVar73._0_4_)))),
                               auVar93,ZEXT1632(auVar158));
    auVar127._0_4_ = auVar131._0_4_ + auVar300._0_4_;
    auVar127._4_4_ = auVar131._4_4_ + auVar300._4_4_;
    auVar127._8_4_ = auVar131._8_4_ + auVar300._8_4_;
    auVar127._12_4_ = auVar131._12_4_ + auVar300._12_4_;
    auVar127._16_4_ = auVar300._16_4_ + 0.0;
    auVar127._20_4_ = auVar300._20_4_ + 0.0;
    auVar127._24_4_ = auVar300._24_4_ + 0.0;
    auVar127._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar74._12_4_ * fVar146,
                                                 CONCAT48(auVar74._8_4_ * fVar70,
                                                          CONCAT44(auVar74._4_4_ * fVar147,
                                                                   auVar74._0_4_ * fVar99)))),
                              auVar93,ZEXT1632(auVar15));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar293._12_4_ * fVar146,
                                                 CONCAT48(auVar293._8_4_ * fVar70,
                                                          CONCAT44(auVar293._4_4_ * fVar147,
                                                                   auVar293._0_4_ * fVar99)))),
                              auVar93,ZEXT1632(auVar73));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar15._12_4_,
                                                 CONCAT48(fVar70 * auVar15._8_4_,
                                                          CONCAT44(fVar147 * auVar15._4_4_,
                                                                   fVar99 * auVar15._0_4_)))),
                              auVar93,ZEXT1632(auVar16));
    auVar293 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar73._12_4_ * fVar146,
                                                  CONCAT48(auVar73._8_4_ * fVar70,
                                                           CONCAT44(auVar73._4_4_ * fVar147,
                                                                    auVar73._0_4_ * fVar99)))),
                               ZEXT1632(auVar158),auVar93);
    auVar93 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar26 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar158));
    auVar324._0_4_ = fStack_268 * auVar93._0_4_ * 3.0;
    auVar324._4_4_ = fStack_268 * auVar93._4_4_ * 3.0;
    auVar324._8_4_ = fStack_268 * auVar93._8_4_ * 3.0;
    auVar324._12_4_ = fStack_268 * auVar93._12_4_ * 3.0;
    auVar324._16_4_ = fStack_268 * auVar93._16_4_ * 3.0;
    auVar324._20_4_ = fStack_268 * auVar93._20_4_ * 3.0;
    auVar324._24_4_ = fStack_268 * auVar93._24_4_ * 3.0;
    auVar324._28_4_ = 0;
    local_280 = fStack_268 * auVar26._0_4_ * 3.0;
    fStack_27c = fStack_268 * auVar26._4_4_ * 3.0;
    auVar38._4_4_ = fStack_27c;
    auVar38._0_4_ = local_280;
    fStack_278 = fStack_268 * auVar26._8_4_ * 3.0;
    auVar38._8_4_ = fStack_278;
    fStack_274 = fStack_268 * auVar26._12_4_ * 3.0;
    auVar38._12_4_ = fStack_274;
    fStack_270 = fStack_268 * auVar26._16_4_ * 3.0;
    auVar38._16_4_ = fStack_270;
    fStack_26c = fStack_268 * auVar26._20_4_ * 3.0;
    auVar38._20_4_ = fStack_26c;
    fStack_268 = fStack_268 * auVar26._24_4_ * 3.0;
    auVar38._24_4_ = fStack_268;
    auVar38._28_4_ = 0x40400000;
    auVar29 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar74));
    auVar30 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar293));
    auVar93 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar131));
    auVar26 = vsubps_avx(ZEXT1632(auVar293),ZEXT1632(auVar72));
    auVar94 = vsubps_avx(auVar29,auVar27);
    fVar167 = auVar93._0_4_ + auVar94._0_4_;
    fVar233 = auVar93._4_4_ + auVar94._4_4_;
    fVar234 = auVar93._8_4_ + auVar94._8_4_;
    fVar235 = auVar93._12_4_ + auVar94._12_4_;
    fVar236 = auVar93._16_4_ + auVar94._16_4_;
    fVar237 = auVar93._20_4_ + auVar94._20_4_;
    fVar238 = auVar93._24_4_ + auVar94._24_4_;
    auVar25 = vsubps_avx(auVar30,auVar28);
    auVar95._0_4_ = auVar26._0_4_ + auVar25._0_4_;
    auVar95._4_4_ = auVar26._4_4_ + auVar25._4_4_;
    auVar95._8_4_ = auVar26._8_4_ + auVar25._8_4_;
    auVar95._12_4_ = auVar26._12_4_ + auVar25._12_4_;
    auVar95._16_4_ = auVar26._16_4_ + auVar25._16_4_;
    auVar95._20_4_ = auVar26._20_4_ + auVar25._20_4_;
    auVar95._24_4_ = auVar26._24_4_ + auVar25._24_4_;
    auVar95._28_4_ = auVar26._28_4_ + auVar25._28_4_;
    local_220 = ZEXT1632(auVar72);
    fVar99 = auVar72._0_4_;
    local_2a0 = (float)local_600._0_4_ + fVar99;
    fVar147 = auVar72._4_4_;
    fStack_29c = (float)local_600._4_4_ + fVar147;
    fVar70 = auVar72._8_4_;
    fStack_298 = fStack_5f8 + fVar70;
    fVar146 = auVar72._12_4_;
    fStack_294 = fStack_5f4 + fVar146;
    fStack_290 = fStack_5f0 + 0.0;
    fStack_28c = fStack_5ec + 0.0;
    fStack_288 = fStack_5e8 + 0.0;
    local_1e0 = ZEXT1632(auVar131);
    auVar26 = vsubps_avx(local_1e0,auVar300);
    local_200 = vpermps_avx2(_DAT_01fec480,auVar26);
    auVar26 = vsubps_avx(local_220,_local_600);
    local_2c0 = vpermps_avx2(_DAT_01fec480,auVar26);
    local_240._0_4_ = auVar74._0_4_ + auVar324._0_4_;
    local_240._4_4_ = auVar74._4_4_ + auVar324._4_4_;
    local_240._8_4_ = auVar74._8_4_ + auVar324._8_4_;
    local_240._12_4_ = auVar74._12_4_ + auVar324._12_4_;
    local_240._16_4_ = auVar324._16_4_ + 0.0;
    local_240._20_4_ = auVar324._20_4_ + 0.0;
    local_240._24_4_ = auVar324._24_4_ + 0.0;
    local_240._28_4_ = 0;
    auVar301 = ZEXT1632(auVar74);
    auVar26 = vsubps_avx(auVar301,auVar324);
    auVar31 = vpermps_avx2(_DAT_01fec480,auVar26);
    fVar129 = auVar293._0_4_;
    local_280 = fVar129 + local_280;
    fVar142 = auVar293._4_4_;
    fStack_27c = fVar142 + fStack_27c;
    fVar143 = auVar293._8_4_;
    fStack_278 = fVar143 + fStack_278;
    fVar144 = auVar293._12_4_;
    fStack_274 = fVar144 + fStack_274;
    fStack_270 = fStack_270 + 0.0;
    fStack_26c = fStack_26c + 0.0;
    fStack_268 = fStack_268 + 0.0;
    auVar26 = vsubps_avx(ZEXT1632(auVar293),auVar38);
    local_260 = vpermps_avx2(_DAT_01fec480,auVar26);
    auVar39._4_4_ = fVar147 * fVar233;
    auVar39._0_4_ = fVar99 * fVar167;
    auVar39._8_4_ = fVar70 * fVar234;
    auVar39._12_4_ = fVar146 * fVar235;
    auVar39._16_4_ = fVar236 * 0.0;
    auVar39._20_4_ = fVar237 * 0.0;
    auVar39._24_4_ = fVar238 * 0.0;
    auVar39._28_4_ = auVar26._28_4_;
    auVar15 = vfnmadd231ps_fma(auVar39,local_1e0,auVar95);
    fStack_284 = fStack_5e4 + 0.0;
    auVar40._4_4_ = fStack_29c * fVar233;
    auVar40._0_4_ = local_2a0 * fVar167;
    auVar40._8_4_ = fStack_298 * fVar234;
    auVar40._12_4_ = fStack_294 * fVar235;
    auVar40._16_4_ = fStack_290 * fVar236;
    auVar40._20_4_ = fStack_28c * fVar237;
    auVar40._24_4_ = fStack_288 * fVar238;
    auVar40._28_4_ = 0;
    auVar16 = vfnmadd231ps_fma(auVar40,auVar95,auVar127);
    auVar41._4_4_ = local_2c0._4_4_ * fVar233;
    auVar41._0_4_ = local_2c0._0_4_ * fVar167;
    auVar41._8_4_ = local_2c0._8_4_ * fVar234;
    auVar41._12_4_ = local_2c0._12_4_ * fVar235;
    auVar41._16_4_ = local_2c0._16_4_ * fVar236;
    auVar41._20_4_ = local_2c0._20_4_ * fVar237;
    auVar41._24_4_ = local_2c0._24_4_ * fVar238;
    auVar41._28_4_ = fStack_5e4 + 0.0;
    auVar158 = vfnmadd231ps_fma(auVar41,local_200,auVar95);
    local_760._0_4_ = auVar28._0_4_;
    local_760._4_4_ = auVar28._4_4_;
    uStack_758._0_4_ = auVar28._8_4_;
    uStack_758._4_4_ = auVar28._12_4_;
    uStack_750._0_4_ = auVar28._16_4_;
    uStack_750._4_4_ = auVar28._20_4_;
    uStack_748._0_4_ = auVar28._24_4_;
    uStack_748._4_4_ = auVar28._28_4_;
    auVar42._4_4_ = (float)local_760._4_4_ * fVar233;
    auVar42._0_4_ = (float)local_760._0_4_ * fVar167;
    auVar42._8_4_ = (float)uStack_758 * fVar234;
    auVar42._12_4_ = uStack_758._4_4_ * fVar235;
    auVar42._16_4_ = (float)uStack_750 * fVar236;
    auVar42._20_4_ = uStack_750._4_4_ * fVar237;
    auVar42._24_4_ = (float)uStack_748 * fVar238;
    auVar42._28_4_ = uStack_748._4_4_;
    auVar73 = vfnmadd231ps_fma(auVar42,auVar27,auVar95);
    auVar254._0_4_ = fVar129 * fVar167;
    auVar254._4_4_ = fVar142 * fVar233;
    auVar254._8_4_ = fVar143 * fVar234;
    auVar254._12_4_ = fVar144 * fVar235;
    auVar254._16_4_ = fVar236 * 0.0;
    auVar254._20_4_ = fVar237 * 0.0;
    auVar254._24_4_ = fVar238 * 0.0;
    auVar254._28_4_ = 0;
    auVar74 = vfnmadd231ps_fma(auVar254,auVar301,auVar95);
    uStack_264 = 0x40400000;
    auVar43._4_4_ = fStack_27c * fVar233;
    auVar43._0_4_ = local_280 * fVar167;
    auVar43._8_4_ = fStack_278 * fVar234;
    auVar43._12_4_ = fStack_274 * fVar235;
    auVar43._16_4_ = fStack_270 * fVar236;
    auVar43._20_4_ = fStack_26c * fVar237;
    auVar43._24_4_ = fStack_268 * fVar238;
    auVar43._28_4_ = auVar27._28_4_;
    auVar72 = vfnmadd231ps_fma(auVar43,local_240,auVar95);
    auVar44._4_4_ = local_260._4_4_ * fVar233;
    auVar44._0_4_ = local_260._0_4_ * fVar167;
    auVar44._8_4_ = local_260._8_4_ * fVar234;
    auVar44._12_4_ = local_260._12_4_ * fVar235;
    auVar44._16_4_ = local_260._16_4_ * fVar236;
    auVar44._20_4_ = local_260._20_4_ * fVar237;
    auVar44._24_4_ = local_260._24_4_ * fVar238;
    auVar44._28_4_ = local_260._28_4_;
    auVar110 = vfnmadd231ps_fma(auVar44,auVar31,auVar95);
    auVar45._4_4_ = auVar30._4_4_ * fVar233;
    auVar45._0_4_ = auVar30._0_4_ * fVar167;
    auVar45._8_4_ = auVar30._8_4_ * fVar234;
    auVar45._12_4_ = auVar30._12_4_ * fVar235;
    auVar45._16_4_ = auVar30._16_4_ * fVar236;
    auVar45._20_4_ = auVar30._20_4_ * fVar237;
    auVar45._24_4_ = auVar30._24_4_ * fVar238;
    auVar45._28_4_ = auVar93._28_4_ + auVar94._28_4_;
    auVar287 = vfnmadd231ps_fma(auVar45,auVar29,auVar95);
    auVar26 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar93 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar94 = vminps_avx(ZEXT1632(auVar158),ZEXT1632(auVar73));
    auVar94 = vminps_avx(auVar26,auVar94);
    auVar26 = vmaxps_avx(ZEXT1632(auVar158),ZEXT1632(auVar73));
    auVar93 = vmaxps_avx(auVar93,auVar26);
    auVar25 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar72));
    auVar26 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar72));
    auVar17 = vminps_avx(ZEXT1632(auVar110),ZEXT1632(auVar287));
    auVar25 = vminps_avx(auVar25,auVar17);
    auVar25 = vminps_avx(auVar94,auVar25);
    auVar94 = vmaxps_avx(ZEXT1632(auVar110),ZEXT1632(auVar287));
    auVar26 = vmaxps_avx(auVar26,auVar94);
    auVar26 = vmaxps_avx(auVar93,auVar26);
    auVar53._4_4_ = fStack_37c;
    auVar53._0_4_ = local_380;
    auVar53._8_4_ = fStack_378;
    auVar53._12_4_ = fStack_374;
    auVar53._16_4_ = fStack_370;
    auVar53._20_4_ = fStack_36c;
    auVar53._24_4_ = fStack_368;
    auVar53._28_4_ = fStack_364;
    auVar93 = vcmpps_avx(auVar25,auVar53,2);
    auVar55._4_4_ = fStack_1bc;
    auVar55._0_4_ = local_1c0;
    auVar55._8_4_ = fStack_1b8;
    auVar55._12_4_ = fStack_1b4;
    auVar55._16_4_ = fStack_1b0;
    auVar55._20_4_ = fStack_1ac;
    auVar55._24_4_ = fStack_1a8;
    auVar55._28_4_ = fStack_1a4;
    auVar26 = vcmpps_avx(auVar26,auVar55,5);
    auVar93 = vandps_avx(auVar26,auVar93);
    auVar26 = local_2e0 & auVar93;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar26 = vsubps_avx(auVar27,local_1e0);
      auVar94 = vsubps_avx(auVar29,auVar301);
      fVar233 = auVar26._0_4_ + auVar94._0_4_;
      fVar234 = auVar26._4_4_ + auVar94._4_4_;
      fVar235 = auVar26._8_4_ + auVar94._8_4_;
      fVar236 = auVar26._12_4_ + auVar94._12_4_;
      fVar237 = auVar26._16_4_ + auVar94._16_4_;
      fVar238 = auVar26._20_4_ + auVar94._20_4_;
      fVar100 = auVar26._24_4_ + auVar94._24_4_;
      auVar25 = vsubps_avx(auVar28,local_220);
      auVar17 = vsubps_avx(auVar30,ZEXT1632(auVar293));
      auVar128._0_4_ = auVar25._0_4_ + auVar17._0_4_;
      auVar128._4_4_ = auVar25._4_4_ + auVar17._4_4_;
      auVar128._8_4_ = auVar25._8_4_ + auVar17._8_4_;
      auVar128._12_4_ = auVar25._12_4_ + auVar17._12_4_;
      auVar128._16_4_ = auVar25._16_4_ + auVar17._16_4_;
      auVar128._20_4_ = auVar25._20_4_ + auVar17._20_4_;
      auVar128._24_4_ = auVar25._24_4_ + auVar17._24_4_;
      fVar167 = auVar17._28_4_;
      auVar128._28_4_ = auVar25._28_4_ + fVar167;
      auVar46._4_4_ = fVar147 * fVar234;
      auVar46._0_4_ = fVar99 * fVar233;
      auVar46._8_4_ = fVar70 * fVar235;
      auVar46._12_4_ = fVar146 * fVar236;
      auVar46._16_4_ = fVar237 * 0.0;
      auVar46._20_4_ = fVar238 * 0.0;
      auVar46._24_4_ = fVar100 * 0.0;
      auVar46._28_4_ = auVar29._28_4_;
      auVar74 = vfnmadd231ps_fma(auVar46,auVar128,local_1e0);
      auVar47._4_4_ = fVar234 * fStack_29c;
      auVar47._0_4_ = fVar233 * local_2a0;
      auVar47._8_4_ = fVar235 * fStack_298;
      auVar47._12_4_ = fVar236 * fStack_294;
      auVar47._16_4_ = fVar237 * fStack_290;
      auVar47._20_4_ = fVar238 * fStack_28c;
      auVar47._24_4_ = fVar100 * fStack_288;
      auVar47._28_4_ = 0;
      auVar15 = vfnmadd213ps_fma(auVar127,auVar128,auVar47);
      auVar48._4_4_ = fVar234 * local_2c0._4_4_;
      auVar48._0_4_ = fVar233 * local_2c0._0_4_;
      auVar48._8_4_ = fVar235 * local_2c0._8_4_;
      auVar48._12_4_ = fVar236 * local_2c0._12_4_;
      auVar48._16_4_ = fVar237 * local_2c0._16_4_;
      auVar48._20_4_ = fVar238 * local_2c0._20_4_;
      auVar48._24_4_ = fVar100 * local_2c0._24_4_;
      auVar48._28_4_ = 0;
      auVar16 = vfnmadd213ps_fma(local_200,auVar128,auVar48);
      auVar49._4_4_ = (float)local_760._4_4_ * fVar234;
      auVar49._0_4_ = (float)local_760._0_4_ * fVar233;
      auVar49._8_4_ = (float)uStack_758 * fVar235;
      auVar49._12_4_ = uStack_758._4_4_ * fVar236;
      auVar49._16_4_ = (float)uStack_750 * fVar237;
      auVar49._20_4_ = uStack_750._4_4_ * fVar238;
      auVar49._24_4_ = (float)uStack_748 * fVar100;
      auVar49._28_4_ = 0;
      auVar293 = vfnmadd231ps_fma(auVar49,auVar128,auVar27);
      auVar163._0_4_ = fVar129 * fVar233;
      auVar163._4_4_ = fVar142 * fVar234;
      auVar163._8_4_ = fVar143 * fVar235;
      auVar163._12_4_ = fVar144 * fVar236;
      auVar163._16_4_ = fVar237 * 0.0;
      auVar163._20_4_ = fVar238 * 0.0;
      auVar163._24_4_ = fVar100 * 0.0;
      auVar163._28_4_ = 0;
      auVar72 = vfnmadd231ps_fma(auVar163,auVar128,auVar301);
      auVar50._4_4_ = fVar234 * fStack_27c;
      auVar50._0_4_ = fVar233 * local_280;
      auVar50._8_4_ = fVar235 * fStack_278;
      auVar50._12_4_ = fVar236 * fStack_274;
      auVar50._16_4_ = fVar237 * fStack_270;
      auVar50._20_4_ = fVar238 * fStack_26c;
      auVar50._24_4_ = fVar100 * fStack_268;
      auVar50._28_4_ = fVar167;
      auVar158 = vfnmadd213ps_fma(local_240,auVar128,auVar50);
      auVar51._4_4_ = fVar234 * local_260._4_4_;
      auVar51._0_4_ = fVar233 * local_260._0_4_;
      auVar51._8_4_ = fVar235 * local_260._8_4_;
      auVar51._12_4_ = fVar236 * local_260._12_4_;
      auVar51._16_4_ = fVar237 * local_260._16_4_;
      auVar51._20_4_ = fVar238 * local_260._20_4_;
      auVar51._24_4_ = fVar100 * local_260._24_4_;
      auVar51._28_4_ = fVar167;
      auVar73 = vfnmadd213ps_fma(auVar31,auVar128,auVar51);
      auVar52._4_4_ = fVar234 * auVar30._4_4_;
      auVar52._0_4_ = fVar233 * auVar30._0_4_;
      auVar52._8_4_ = fVar235 * auVar30._8_4_;
      auVar52._12_4_ = fVar236 * auVar30._12_4_;
      auVar52._16_4_ = fVar237 * auVar30._16_4_;
      auVar52._20_4_ = fVar238 * auVar30._20_4_;
      auVar52._24_4_ = fVar100 * auVar30._24_4_;
      auVar52._28_4_ = auVar26._28_4_ + auVar94._28_4_;
      auVar110 = vfnmadd231ps_fma(auVar52,auVar128,auVar29);
      auVar94 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar15));
      auVar26 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar15));
      auVar25 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar293));
      auVar25 = vminps_avx(auVar94,auVar25);
      auVar94 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar293));
      auVar26 = vmaxps_avx(auVar26,auVar94);
      auVar17 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar158));
      auVar94 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar158));
      auVar27 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar110));
      auVar17 = vminps_avx(auVar17,auVar27);
      auVar17 = vminps_avx(auVar25,auVar17);
      auVar25 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar110));
      auVar94 = vmaxps_avx(auVar94,auVar25);
      auVar94 = vmaxps_avx(auVar26,auVar94);
      auVar54._4_4_ = fStack_37c;
      auVar54._0_4_ = local_380;
      auVar54._8_4_ = fStack_378;
      auVar54._12_4_ = fStack_374;
      auVar54._16_4_ = fStack_370;
      auVar54._20_4_ = fStack_36c;
      auVar54._24_4_ = fStack_368;
      auVar54._28_4_ = fStack_364;
      auVar26 = vcmpps_avx(auVar17,auVar54,2);
      auVar94 = vcmpps_avx(auVar94,auVar55,5);
      auVar26 = vandps_avx(auVar94,auVar26);
      auVar93 = vandps_avx(auVar93,local_2e0);
      auVar94 = auVar93 & auVar26;
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0x7f,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0xbf,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar94[0x1f] < '\0') {
        auVar93 = vandps_avx(auVar26,auVar93);
        uVar66 = vmovmskps_avx(auVar93);
        if (uVar66 != 0) {
          uVar62 = (ulong)uVar68;
          auStack_4b0[uVar62] = uVar66 & 0xff;
          uVar101 = vmovlps_avx(local_420);
          *(undefined8 *)(&uStack_360 + uVar62 * 2) = uVar101;
          uVar61 = vmovlps_avx(auVar190);
          auStack_1a0[uVar62] = uVar61;
          uVar68 = uVar68 + 1;
        }
      }
    }
    if (uVar68 != 0) {
      do {
        uVar62 = (ulong)(uVar68 - 1);
        uVar65 = auStack_4b0[uVar62];
        uVar66 = (&uStack_360)[uVar62 * 2];
        fVar99 = afStack_35c[uVar62 * 2];
        iVar59 = 0;
        for (uVar61 = (ulong)uVar65; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
          iVar59 = iVar59 + 1;
        }
        uVar65 = uVar65 - 1 & uVar65;
        if (uVar65 == 0) {
          uVar68 = uVar68 - 1;
        }
        auVar191._8_8_ = 0;
        auVar191._0_8_ = auStack_1a0[uVar62];
        auVar201 = ZEXT1664(auVar191);
        auStack_4b0[uVar62] = uVar65;
        fVar147 = (float)(iVar59 + 1) * 0.14285715;
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * (float)iVar59 * 0.14285715)),
                                  ZEXT416(uVar66),ZEXT416((uint)(1.0 - (float)iVar59 * 0.14285715)))
        ;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * fVar147)),ZEXT416(uVar66),
                                  ZEXT416((uint)(1.0 - fVar147)));
        fVar147 = auVar16._0_4_;
        fVar70 = auVar15._0_4_;
        fVar99 = fVar147 - fVar70;
        if (0.16666667 <= fVar99) {
          auVar15 = vinsertps_avx(auVar15,auVar16,0x10);
          auVar291 = ZEXT1664(auVar15);
          goto LAB_016df388;
        }
        auVar158 = vshufps_avx(auVar191,auVar191,0x50);
        auVar116._8_4_ = 0x3f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar116._12_4_ = 0x3f800000;
        auVar73 = vsubps_avx(auVar116,auVar158);
        fVar146 = auVar158._0_4_;
        auVar177._0_4_ = fVar146 * fVar145;
        fVar129 = auVar158._4_4_;
        auVar177._4_4_ = fVar129 * fVar165;
        fVar142 = auVar158._8_4_;
        auVar177._8_4_ = fVar142 * fVar145;
        fVar143 = auVar158._12_4_;
        auVar177._12_4_ = fVar143 * fVar165;
        auVar192._0_4_ = fVar166 * fVar146;
        auVar192._4_4_ = fVar182 * fVar129;
        auVar192._8_4_ = fVar166 * fVar142;
        auVar192._12_4_ = fVar182 * fVar143;
        auVar216._0_4_ = fVar202 * fVar146;
        auVar216._4_4_ = fVar203 * fVar129;
        auVar216._8_4_ = fVar202 * fVar142;
        auVar216._12_4_ = fVar203 * fVar143;
        auVar82._0_4_ = fVar255 * fVar146;
        auVar82._4_4_ = fVar269 * fVar129;
        auVar82._8_4_ = fVar255 * fVar142;
        auVar82._12_4_ = fVar269 * fVar143;
        auVar158 = vfmadd231ps_fma(auVar177,auVar73,auVar247);
        auVar74 = vfmadd231ps_fma(auVar192,auVar73,auVar272);
        auVar293 = vfmadd231ps_fma(auVar216,auVar73,auVar306);
        auVar73 = vfmadd231ps_fma(auVar82,auVar73,auVar319);
        auVar164._16_16_ = auVar158;
        auVar164._0_16_ = auVar158;
        auVar181._16_16_ = auVar74;
        auVar181._0_16_ = auVar74;
        auVar200._16_16_ = auVar293;
        auVar200._0_16_ = auVar293;
        auVar232._4_4_ = fVar70;
        auVar232._0_4_ = fVar70;
        auVar232._8_4_ = fVar70;
        auVar232._12_4_ = fVar70;
        auVar232._20_4_ = fVar147;
        auVar232._16_4_ = fVar147;
        auVar232._24_4_ = fVar147;
        auVar232._28_4_ = fVar147;
        auVar93 = vsubps_avx(auVar181,auVar164);
        auVar74 = vfmadd213ps_fma(auVar93,auVar232,auVar164);
        auVar93 = vsubps_avx(auVar200,auVar181);
        auVar72 = vfmadd213ps_fma(auVar93,auVar232,auVar181);
        auVar158 = vsubps_avx(auVar73,auVar293);
        auVar96._16_16_ = auVar158;
        auVar96._0_16_ = auVar158;
        auVar158 = vfmadd213ps_fma(auVar96,auVar232,auVar200);
        auVar93 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar74));
        auVar73 = vfmadd213ps_fma(auVar93,auVar232,ZEXT1632(auVar74));
        auVar93 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar72));
        auVar158 = vfmadd213ps_fma(auVar93,auVar232,ZEXT1632(auVar72));
        auVar93 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar73));
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar93,auVar232);
        fVar146 = fVar99 * 0.33333334;
        auVar226._0_8_ =
             CONCAT44(auVar130._4_4_ + fVar146 * auVar93._4_4_ * 3.0,
                      auVar130._0_4_ + fVar146 * auVar93._0_4_ * 3.0);
        auVar226._8_4_ = auVar130._8_4_ + fVar146 * auVar93._8_4_ * 3.0;
        auVar226._12_4_ = auVar130._12_4_ + fVar146 * auVar93._12_4_ * 3.0;
        auVar73 = vshufpd_avx(auVar130,auVar130,3);
        auVar74 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar158 = vsubps_avx(auVar73,auVar130);
        auVar293 = vsubps_avx(auVar74,(undefined1  [16])0x0);
        auVar83._0_4_ = auVar158._0_4_ + auVar293._0_4_;
        auVar83._4_4_ = auVar158._4_4_ + auVar293._4_4_;
        auVar83._8_4_ = auVar158._8_4_ + auVar293._8_4_;
        auVar83._12_4_ = auVar158._12_4_ + auVar293._12_4_;
        auVar158 = vshufps_avx(auVar130,auVar130,0xb1);
        auVar293 = vshufps_avx(auVar226,auVar226,0xb1);
        auVar320._4_4_ = auVar83._0_4_;
        auVar320._0_4_ = auVar83._0_4_;
        auVar320._8_4_ = auVar83._0_4_;
        auVar320._12_4_ = auVar83._0_4_;
        auVar72 = vshufps_avx(auVar83,auVar83,0x55);
        fVar129 = auVar72._0_4_;
        auVar84._0_4_ = fVar129 * auVar158._0_4_;
        fVar142 = auVar72._4_4_;
        auVar84._4_4_ = fVar142 * auVar158._4_4_;
        fVar143 = auVar72._8_4_;
        auVar84._8_4_ = fVar143 * auVar158._8_4_;
        fVar144 = auVar72._12_4_;
        auVar84._12_4_ = fVar144 * auVar158._12_4_;
        auVar193._0_4_ = fVar129 * auVar293._0_4_;
        auVar193._4_4_ = fVar142 * auVar293._4_4_;
        auVar193._8_4_ = fVar143 * auVar293._8_4_;
        auVar193._12_4_ = fVar144 * auVar293._12_4_;
        auVar110 = vfmadd231ps_fma(auVar84,auVar320,auVar130);
        auVar287 = vfmadd231ps_fma(auVar193,auVar320,auVar226);
        auVar293 = vshufps_avx(auVar110,auVar110,0xe8);
        auVar72 = vshufps_avx(auVar287,auVar287,0xe8);
        auVar158 = vcmpps_avx(auVar293,auVar72,1);
        uVar66 = vextractps_avx(auVar158,0);
        auVar131 = auVar287;
        if ((uVar66 & 1) == 0) {
          auVar131 = auVar110;
        }
        auVar154._0_4_ = fVar146 * auVar93._16_4_ * 3.0;
        auVar154._4_4_ = fVar146 * auVar93._20_4_ * 3.0;
        auVar154._8_4_ = fVar146 * auVar93._24_4_ * 3.0;
        auVar154._12_4_ = fVar146 * 0.0;
        auVar204 = vsubps_avx((undefined1  [16])0x0,auVar154);
        auVar155 = vshufps_avx(auVar204,auVar204,0xb1);
        auVar183 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar227._0_4_ = fVar129 * auVar155._0_4_;
        auVar227._4_4_ = fVar142 * auVar155._4_4_;
        auVar227._8_4_ = fVar143 * auVar155._8_4_;
        auVar227._12_4_ = fVar144 * auVar155._12_4_;
        auVar248._0_4_ = auVar183._0_4_ * fVar129;
        auVar248._4_4_ = auVar183._4_4_ * fVar142;
        auVar248._8_4_ = auVar183._8_4_ * fVar143;
        auVar248._12_4_ = auVar183._12_4_ * fVar144;
        auVar221 = vfmadd231ps_fma(auVar227,auVar320,auVar204);
        auVar222 = vfmadd231ps_fma(auVar248,(undefined1  [16])0x0,auVar320);
        auVar183 = vshufps_avx(auVar221,auVar221,0xe8);
        auVar190 = vshufps_avx(auVar222,auVar222,0xe8);
        auVar155 = vcmpps_avx(auVar183,auVar190,1);
        uVar66 = vextractps_avx(auVar155,0);
        auVar239 = auVar222;
        if ((uVar66 & 1) == 0) {
          auVar239 = auVar221;
        }
        auVar131 = vmaxss_avx(auVar239,auVar131);
        auVar293 = vminps_avx(auVar293,auVar72);
        auVar72 = vminps_avx(auVar183,auVar190);
        auVar72 = vminps_avx(auVar293,auVar72);
        auVar158 = vshufps_avx(auVar158,auVar158,0x55);
        auVar158 = vblendps_avx(auVar158,auVar155,2);
        auVar155 = vpslld_avx(auVar158,0x1f);
        auVar158 = vshufpd_avx(auVar287,auVar287,1);
        auVar158 = vinsertps_avx(auVar158,auVar222,0x9c);
        auVar293 = vshufpd_avx(auVar110,auVar110,1);
        auVar293 = vinsertps_avx(auVar293,auVar221,0x9c);
        auVar158 = vblendvps_avx(auVar293,auVar158,auVar155);
        auVar293 = vmovshdup_avx(auVar158);
        auVar158 = vmaxss_avx(auVar293,auVar158);
        fVar143 = auVar72._0_4_;
        auVar293 = vmovshdup_avx(auVar72);
        fVar142 = auVar158._0_4_;
        fVar146 = auVar293._0_4_;
        fVar129 = auVar131._0_4_;
        if (((fVar143 < 0.0001) && (-0.0001 < fVar142)) || (fVar146 < 0.0001 && -0.0001 < fVar142))
        {
LAB_016dfc47:
          auVar110 = vcmpps_avx(auVar72,_DAT_01f7aa10,1);
          auVar287 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar293 = vcmpss_avx(auVar131,ZEXT816(0) << 0x20,1);
          auVar117._8_4_ = 0x3f800000;
          auVar117._0_8_ = 0x3f8000003f800000;
          auVar117._12_4_ = 0x3f800000;
          auVar136._8_4_ = 0xbf800000;
          auVar136._0_8_ = 0xbf800000bf800000;
          auVar136._12_4_ = 0xbf800000;
          auVar293 = vblendvps_avx(auVar117,auVar136,auVar293);
          auVar110 = vblendvps_avx(auVar117,auVar136,auVar110);
          fVar167 = auVar110._0_4_;
          fVar144 = auVar293._0_4_;
          auVar293 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar167 == fVar144) && (!NAN(fVar167) && !NAN(fVar144))) {
            auVar293 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar167 == fVar144) && (!NAN(fVar167) && !NAN(fVar144))) {
            auVar287 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar110 = vmovshdup_avx(auVar110);
          fVar233 = auVar110._0_4_;
          if ((fVar167 != fVar233) || (NAN(fVar167) || NAN(fVar233))) {
            if ((fVar146 != fVar143) || (NAN(fVar146) || NAN(fVar143))) {
              auVar156._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar156._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar156._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar157._0_4_ = -fVar143 / (fVar146 - fVar143);
              auVar157._4_12_ = auVar156._4_12_;
              auVar72 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar157._0_4_)),auVar157,ZEXT416(0));
              auVar110 = auVar72;
            }
            else {
              auVar72 = ZEXT816(0) << 0x20;
              if ((fVar143 != 0.0) || (auVar110 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar143))) {
                auVar72 = SUB6416(ZEXT464(0x7f800000),0);
                auVar110 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar293 = vminss_avx(auVar293,auVar72);
            auVar287 = vmaxss_avx(auVar110,auVar287);
          }
          auVar158 = vcmpss_avx(auVar158,ZEXT416(0),1);
          auVar118._8_4_ = 0x3f800000;
          auVar118._0_8_ = 0x3f8000003f800000;
          auVar118._12_4_ = 0x3f800000;
          auVar137._8_4_ = 0xbf800000;
          auVar137._0_8_ = 0xbf800000bf800000;
          auVar137._12_4_ = 0xbf800000;
          auVar158 = vblendvps_avx(auVar118,auVar137,auVar158);
          fVar146 = auVar158._0_4_;
          if ((fVar144 != fVar146) || (NAN(fVar144) || NAN(fVar146))) {
            if ((fVar142 != fVar129) || (NAN(fVar142) || NAN(fVar129))) {
              auVar85._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
              auVar85._8_4_ = auVar131._8_4_ ^ 0x80000000;
              auVar85._12_4_ = auVar131._12_4_ ^ 0x80000000;
              auVar159._0_4_ = -fVar129 / (fVar142 - fVar129);
              auVar159._4_12_ = auVar85._4_12_;
              auVar158 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar159._0_4_)),auVar159,ZEXT416(0));
              auVar72 = auVar158;
            }
            else {
              auVar158 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar129 != 0.0) || (auVar72 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar129))) {
                auVar158 = SUB6416(ZEXT464(0xff800000),0);
                auVar72 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar293 = vminss_avx(auVar293,auVar72);
            auVar287 = vmaxss_avx(auVar158,auVar287);
          }
          if ((fVar233 != fVar146) || (NAN(fVar233) || NAN(fVar146))) {
            auVar293 = vminss_avx(auVar293,SUB6416(ZEXT464(0x3f800000),0));
            auVar287 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar287);
          }
          auVar158 = vmaxss_avx(ZEXT816(0) << 0x40,auVar293);
          auVar293 = vminss_avx(auVar287,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar158._0_4_ <= auVar293._0_4_) {
            auVar158 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar158._0_4_ + -0.1)));
            auVar293 = vminss_avx(ZEXT416((uint)(auVar293._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar178._0_8_ = auVar130._0_8_;
            auVar178._8_8_ = auVar178._0_8_;
            auVar261._8_8_ = auVar226._0_8_;
            auVar261._0_8_ = auVar226._0_8_;
            auVar273._8_8_ = auVar204._0_8_;
            auVar273._0_8_ = auVar204._0_8_;
            auVar72 = vshufpd_avx(auVar226,auVar226,3);
            auVar110 = vshufpd_avx(auVar204,auVar204,3);
            auVar287 = vshufps_avx(auVar158,auVar293,0);
            auVar86._8_4_ = 0x3f800000;
            auVar86._0_8_ = 0x3f8000003f800000;
            auVar86._12_4_ = 0x3f800000;
            auVar130 = vsubps_avx(auVar86,auVar287);
            local_580 = auVar73._0_4_;
            fStack_57c = auVar73._4_4_;
            fStack_578 = auVar73._8_4_;
            fStack_574 = auVar73._12_4_;
            fVar146 = auVar287._0_4_;
            auVar87._0_4_ = fVar146 * local_580;
            fVar129 = auVar287._4_4_;
            auVar87._4_4_ = fVar129 * fStack_57c;
            fVar142 = auVar287._8_4_;
            auVar87._8_4_ = fVar142 * fStack_578;
            fVar143 = auVar287._12_4_;
            auVar87._12_4_ = fVar143 * fStack_574;
            auVar217._0_4_ = fVar146 * auVar72._0_4_;
            auVar217._4_4_ = fVar129 * auVar72._4_4_;
            auVar217._8_4_ = fVar142 * auVar72._8_4_;
            auVar217._12_4_ = fVar143 * auVar72._12_4_;
            auVar228._0_4_ = fVar146 * auVar110._0_4_;
            auVar228._4_4_ = fVar129 * auVar110._4_4_;
            auVar228._8_4_ = fVar142 * auVar110._8_4_;
            auVar228._12_4_ = fVar143 * auVar110._12_4_;
            local_620 = auVar74._0_4_;
            fStack_61c = auVar74._4_4_;
            fStack_618 = auVar74._8_4_;
            fStack_614 = auVar74._12_4_;
            auVar249._0_4_ = fVar146 * local_620;
            auVar249._4_4_ = fVar129 * fStack_61c;
            auVar249._8_4_ = fVar142 * fStack_618;
            auVar249._12_4_ = fVar143 * fStack_614;
            auVar72 = vfmadd231ps_fma(auVar87,auVar130,auVar178);
            auVar110 = vfmadd231ps_fma(auVar217,auVar130,auVar261);
            auVar287 = vfmadd231ps_fma(auVar228,auVar130,auVar273);
            auVar130 = vfmadd231ps_fma(auVar249,auVar130,ZEXT816(0));
            auVar73 = vmovshdup_avx(auVar191);
            auVar204 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar158._0_4_)),auVar191,
                                       ZEXT416((uint)(1.0 - auVar158._0_4_)));
            auVar221 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar293._0_4_)),auVar191,
                                       ZEXT416((uint)(1.0 - auVar293._0_4_)));
            fVar146 = 1.0 / fVar99;
            auVar158 = vsubps_avx(auVar110,auVar72);
            auVar262._0_4_ = auVar158._0_4_ * 3.0;
            auVar262._4_4_ = auVar158._4_4_ * 3.0;
            auVar262._8_4_ = auVar158._8_4_ * 3.0;
            auVar262._12_4_ = auVar158._12_4_ * 3.0;
            auVar158 = vsubps_avx(auVar287,auVar110);
            auVar274._0_4_ = auVar158._0_4_ * 3.0;
            auVar274._4_4_ = auVar158._4_4_ * 3.0;
            auVar274._8_4_ = auVar158._8_4_ * 3.0;
            auVar274._12_4_ = auVar158._12_4_ * 3.0;
            auVar158 = vsubps_avx(auVar130,auVar287);
            auVar288._0_4_ = auVar158._0_4_ * 3.0;
            auVar288._4_4_ = auVar158._4_4_ * 3.0;
            auVar288._8_4_ = auVar158._8_4_ * 3.0;
            auVar288._12_4_ = auVar158._12_4_ * 3.0;
            auVar73 = vminps_avx(auVar274,auVar288);
            auVar158 = vmaxps_avx(auVar274,auVar288);
            auVar73 = vminps_avx(auVar262,auVar73);
            auVar158 = vmaxps_avx(auVar262,auVar158);
            auVar74 = vshufpd_avx(auVar73,auVar73,3);
            auVar293 = vshufpd_avx(auVar158,auVar158,3);
            auVar73 = vminps_avx(auVar73,auVar74);
            auVar158 = vmaxps_avx(auVar158,auVar293);
            auVar275._0_4_ = auVar73._0_4_ * fVar146;
            auVar275._4_4_ = auVar73._4_4_ * fVar146;
            auVar275._8_4_ = auVar73._8_4_ * fVar146;
            auVar275._12_4_ = auVar73._12_4_ * fVar146;
            auVar263._0_4_ = auVar158._0_4_ * fVar146;
            auVar263._4_4_ = auVar158._4_4_ * fVar146;
            auVar263._8_4_ = auVar158._8_4_ * fVar146;
            auVar263._12_4_ = auVar158._12_4_ * fVar146;
            fVar146 = 1.0 / (auVar221._0_4_ - auVar204._0_4_);
            auVar158 = vshufpd_avx(auVar72,auVar72,3);
            auVar73 = vshufpd_avx(auVar110,auVar110,3);
            auVar74 = vshufpd_avx(auVar287,auVar287,3);
            auVar293 = vshufpd_avx(auVar130,auVar130,3);
            auVar158 = vsubps_avx(auVar158,auVar72);
            auVar72 = vsubps_avx(auVar73,auVar110);
            auVar110 = vsubps_avx(auVar74,auVar287);
            auVar293 = vsubps_avx(auVar293,auVar130);
            auVar73 = vminps_avx(auVar158,auVar72);
            auVar158 = vmaxps_avx(auVar158,auVar72);
            auVar74 = vminps_avx(auVar110,auVar293);
            auVar74 = vminps_avx(auVar73,auVar74);
            auVar73 = vmaxps_avx(auVar110,auVar293);
            auVar158 = vmaxps_avx(auVar158,auVar73);
            auVar307._0_4_ = fVar146 * auVar74._0_4_;
            auVar307._4_4_ = fVar146 * auVar74._4_4_;
            auVar307._8_4_ = fVar146 * auVar74._8_4_;
            auVar307._12_4_ = fVar146 * auVar74._12_4_;
            auVar294._0_4_ = fVar146 * auVar158._0_4_;
            auVar294._4_4_ = fVar146 * auVar158._4_4_;
            auVar294._8_4_ = fVar146 * auVar158._8_4_;
            auVar294._12_4_ = fVar146 * auVar158._12_4_;
            auVar293 = vinsertps_avx(auVar15,auVar204,0x10);
            auVar72 = vinsertps_avx(auVar16,auVar221,0x10);
            auVar289._0_4_ = (auVar293._0_4_ + auVar72._0_4_) * 0.5;
            auVar289._4_4_ = (auVar293._4_4_ + auVar72._4_4_) * 0.5;
            auVar289._8_4_ = (auVar293._8_4_ + auVar72._8_4_) * 0.5;
            auVar289._12_4_ = (auVar293._12_4_ + auVar72._12_4_) * 0.5;
            auVar88._4_4_ = auVar289._0_4_;
            auVar88._0_4_ = auVar289._0_4_;
            auVar88._8_4_ = auVar289._0_4_;
            auVar88._12_4_ = auVar289._0_4_;
            auVar158 = vfmadd213ps_fma(local_390,auVar88,auVar18);
            auVar73 = vfmadd213ps_fma(local_3a0,auVar88,auVar19);
            auVar74 = vfmadd213ps_fma(local_3b0,auVar88,auVar20);
            auVar16 = vsubps_avx(auVar73,auVar158);
            auVar158 = vfmadd213ps_fma(auVar16,auVar88,auVar158);
            auVar16 = vsubps_avx(auVar74,auVar73);
            auVar16 = vfmadd213ps_fma(auVar16,auVar88,auVar73);
            auVar16 = vsubps_avx(auVar16,auVar158);
            auVar158 = vfmadd231ps_fma(auVar158,auVar16,auVar88);
            auVar89._0_8_ = CONCAT44(auVar16._4_4_ * 3.0,auVar16._0_4_ * 3.0);
            auVar89._8_4_ = auVar16._8_4_ * 3.0;
            auVar89._12_4_ = auVar16._12_4_ * 3.0;
            auVar321._8_8_ = auVar158._0_8_;
            auVar321._0_8_ = auVar158._0_8_;
            auVar16 = vshufpd_avx(auVar158,auVar158,3);
            auVar158 = vshufps_avx(auVar289,auVar289,0x55);
            auVar287 = vsubps_avx(auVar16,auVar321);
            auVar131 = vfmadd231ps_fma(auVar321,auVar158,auVar287);
            auVar332._8_8_ = auVar89._0_8_;
            auVar332._0_8_ = auVar89._0_8_;
            auVar16 = vshufpd_avx(auVar89,auVar89,3);
            auVar16 = vsubps_avx(auVar16,auVar332);
            auVar130 = vfmadd213ps_fma(auVar16,auVar158,auVar332);
            auVar158 = vmovshdup_avx(auVar130);
            auVar333._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
            auVar333._8_4_ = auVar158._8_4_ ^ 0x80000000;
            auVar333._12_4_ = auVar158._12_4_ ^ 0x80000000;
            auVar73 = vmovshdup_avx(auVar287);
            auVar16 = vunpcklps_avx(auVar73,auVar333);
            auVar74 = vshufps_avx(auVar16,auVar333,4);
            auVar110 = vshufps_avx(auVar289,auVar289,0x54);
            auVar160._0_8_ = auVar287._0_8_ ^ 0x8000000080000000;
            auVar160._8_4_ = auVar287._8_4_ ^ 0x80000000;
            auVar160._12_4_ = auVar287._12_4_ ^ 0x80000000;
            auVar16 = vmovlhps_avx(auVar160,auVar130);
            auVar16 = vshufps_avx(auVar16,auVar130,8);
            auVar158 = vfmsub231ss_fma(ZEXT416((uint)(auVar287._0_4_ * auVar158._0_4_)),auVar73,
                                       auVar130);
            uVar71 = auVar158._0_4_;
            auVar90._4_4_ = uVar71;
            auVar90._0_4_ = uVar71;
            auVar90._8_4_ = uVar71;
            auVar90._12_4_ = uVar71;
            auVar158 = vdivps_avx(auVar74,auVar90);
            auVar73 = vdivps_avx(auVar16,auVar90);
            fVar142 = auVar131._0_4_;
            fVar146 = auVar158._0_4_;
            auVar16 = vshufps_avx(auVar131,auVar131,0x55);
            fVar129 = auVar73._0_4_;
            auVar91._0_4_ = fVar142 * fVar146 + auVar16._0_4_ * fVar129;
            auVar91._4_4_ = fVar142 * auVar158._4_4_ + auVar16._4_4_ * auVar73._4_4_;
            auVar91._8_4_ = fVar142 * auVar158._8_4_ + auVar16._8_4_ * auVar73._8_4_;
            auVar91._12_4_ = fVar142 * auVar158._12_4_ + auVar16._12_4_ * auVar73._12_4_;
            auVar190 = vsubps_avx(auVar110,auVar91);
            auVar110 = vmovshdup_avx(auVar158);
            auVar16 = vinsertps_avx(auVar275,auVar307,0x1c);
            auVar194._0_4_ = auVar110._0_4_ * auVar16._0_4_;
            auVar194._4_4_ = auVar110._4_4_ * auVar16._4_4_;
            auVar194._8_4_ = auVar110._8_4_ * auVar16._8_4_;
            auVar194._12_4_ = auVar110._12_4_ * auVar16._12_4_;
            auVar74 = vinsertps_avx(auVar263,auVar294,0x1c);
            auVar119._0_4_ = auVar74._0_4_ * auVar110._0_4_;
            auVar119._4_4_ = auVar74._4_4_ * auVar110._4_4_;
            auVar119._8_4_ = auVar74._8_4_ * auVar110._8_4_;
            auVar119._12_4_ = auVar74._12_4_ * auVar110._12_4_;
            auVar131 = vminps_avx(auVar194,auVar119);
            auVar130 = vmaxps_avx(auVar119,auVar194);
            auVar110 = vinsertps_avx(auVar307,auVar275,0x4c);
            auVar155 = vmovshdup_avx(auVar73);
            auVar287 = vinsertps_avx(auVar294,auVar263,0x4c);
            auVar295._0_4_ = auVar155._0_4_ * auVar110._0_4_;
            auVar295._4_4_ = auVar155._4_4_ * auVar110._4_4_;
            auVar295._8_4_ = auVar155._8_4_ * auVar110._8_4_;
            auVar295._12_4_ = auVar155._12_4_ * auVar110._12_4_;
            auVar276._0_4_ = auVar155._0_4_ * auVar287._0_4_;
            auVar276._4_4_ = auVar155._4_4_ * auVar287._4_4_;
            auVar276._8_4_ = auVar155._8_4_ * auVar287._8_4_;
            auVar276._12_4_ = auVar155._12_4_ * auVar287._12_4_;
            auVar155 = vminps_avx(auVar295,auVar276);
            auVar308._0_4_ = auVar131._0_4_ + auVar155._0_4_;
            auVar308._4_4_ = auVar131._4_4_ + auVar155._4_4_;
            auVar308._8_4_ = auVar131._8_4_ + auVar155._8_4_;
            auVar308._12_4_ = auVar131._12_4_ + auVar155._12_4_;
            auVar131 = vmaxps_avx(auVar276,auVar295);
            auVar120._0_4_ = auVar131._0_4_ + auVar130._0_4_;
            auVar120._4_4_ = auVar131._4_4_ + auVar130._4_4_;
            auVar120._8_4_ = auVar131._8_4_ + auVar130._8_4_;
            auVar120._12_4_ = auVar131._12_4_ + auVar130._12_4_;
            auVar277._8_8_ = 0x3f80000000000000;
            auVar277._0_8_ = 0x3f80000000000000;
            auVar130 = vsubps_avx(auVar277,auVar120);
            auVar131 = vsubps_avx(auVar277,auVar308);
            auVar155 = vsubps_avx(auVar293,auVar289);
            auVar183 = vsubps_avx(auVar72,auVar289);
            auVar138._0_4_ = fVar146 * auVar16._0_4_;
            auVar138._4_4_ = fVar146 * auVar16._4_4_;
            auVar138._8_4_ = fVar146 * auVar16._8_4_;
            auVar138._12_4_ = fVar146 * auVar16._12_4_;
            auVar309._0_4_ = fVar146 * auVar74._0_4_;
            auVar309._4_4_ = fVar146 * auVar74._4_4_;
            auVar309._8_4_ = fVar146 * auVar74._8_4_;
            auVar309._12_4_ = fVar146 * auVar74._12_4_;
            auVar74 = vminps_avx(auVar138,auVar309);
            auVar16 = vmaxps_avx(auVar309,auVar138);
            auVar195._0_4_ = fVar129 * auVar110._0_4_;
            auVar195._4_4_ = fVar129 * auVar110._4_4_;
            auVar195._8_4_ = fVar129 * auVar110._8_4_;
            auVar195._12_4_ = fVar129 * auVar110._12_4_;
            auVar264._0_4_ = fVar129 * auVar287._0_4_;
            auVar264._4_4_ = fVar129 * auVar287._4_4_;
            auVar264._8_4_ = fVar129 * auVar287._8_4_;
            auVar264._12_4_ = fVar129 * auVar287._12_4_;
            auVar110 = vminps_avx(auVar195,auVar264);
            auVar310._0_4_ = auVar74._0_4_ + auVar110._0_4_;
            auVar310._4_4_ = auVar74._4_4_ + auVar110._4_4_;
            auVar310._8_4_ = auVar74._8_4_ + auVar110._8_4_;
            auVar310._12_4_ = auVar74._12_4_ + auVar110._12_4_;
            fVar233 = auVar155._0_4_;
            auVar322._0_4_ = fVar233 * auVar130._0_4_;
            fVar234 = auVar155._4_4_;
            auVar322._4_4_ = fVar234 * auVar130._4_4_;
            fVar235 = auVar155._8_4_;
            auVar322._8_4_ = fVar235 * auVar130._8_4_;
            fVar236 = auVar155._12_4_;
            auVar322._12_4_ = fVar236 * auVar130._12_4_;
            auVar74 = vmaxps_avx(auVar264,auVar195);
            auVar265._0_4_ = fVar233 * auVar131._0_4_;
            auVar265._4_4_ = fVar234 * auVar131._4_4_;
            auVar265._8_4_ = fVar235 * auVar131._8_4_;
            auVar265._12_4_ = fVar236 * auVar131._12_4_;
            fVar142 = auVar183._0_4_;
            auVar121._0_4_ = fVar142 * auVar130._0_4_;
            fVar143 = auVar183._4_4_;
            auVar121._4_4_ = fVar143 * auVar130._4_4_;
            fVar144 = auVar183._8_4_;
            auVar121._8_4_ = fVar144 * auVar130._8_4_;
            fVar167 = auVar183._12_4_;
            auVar121._12_4_ = fVar167 * auVar130._12_4_;
            auVar278._0_4_ = fVar142 * auVar131._0_4_;
            auVar278._4_4_ = fVar143 * auVar131._4_4_;
            auVar278._8_4_ = fVar144 * auVar131._8_4_;
            auVar278._12_4_ = fVar167 * auVar131._12_4_;
            auVar139._0_4_ = auVar16._0_4_ + auVar74._0_4_;
            auVar139._4_4_ = auVar16._4_4_ + auVar74._4_4_;
            auVar139._8_4_ = auVar16._8_4_ + auVar74._8_4_;
            auVar139._12_4_ = auVar16._12_4_ + auVar74._12_4_;
            auVar196._8_8_ = 0x3f800000;
            auVar196._0_8_ = 0x3f800000;
            auVar16 = vsubps_avx(auVar196,auVar139);
            auVar74 = vsubps_avx(auVar196,auVar310);
            auVar311._0_4_ = fVar233 * auVar16._0_4_;
            auVar311._4_4_ = fVar234 * auVar16._4_4_;
            auVar311._8_4_ = fVar235 * auVar16._8_4_;
            auVar311._12_4_ = fVar236 * auVar16._12_4_;
            auVar296._0_4_ = fVar233 * auVar74._0_4_;
            auVar296._4_4_ = fVar234 * auVar74._4_4_;
            auVar296._8_4_ = fVar235 * auVar74._8_4_;
            auVar296._12_4_ = fVar236 * auVar74._12_4_;
            auVar140._0_4_ = fVar142 * auVar16._0_4_;
            auVar140._4_4_ = fVar143 * auVar16._4_4_;
            auVar140._8_4_ = fVar144 * auVar16._8_4_;
            auVar140._12_4_ = fVar167 * auVar16._12_4_;
            auVar197._0_4_ = fVar142 * auVar74._0_4_;
            auVar197._4_4_ = fVar143 * auVar74._4_4_;
            auVar197._8_4_ = fVar144 * auVar74._8_4_;
            auVar197._12_4_ = fVar167 * auVar74._12_4_;
            auVar16 = vminps_avx(auVar311,auVar296);
            auVar74 = vminps_avx(auVar140,auVar197);
            auVar16 = vminps_avx(auVar16,auVar74);
            auVar74 = vmaxps_avx(auVar296,auVar311);
            auVar110 = vmaxps_avx(auVar197,auVar140);
            auVar287 = vminps_avx(auVar322,auVar265);
            auVar130 = vminps_avx(auVar121,auVar278);
            auVar287 = vminps_avx(auVar287,auVar130);
            auVar16 = vhaddps_avx(auVar16,auVar287);
            auVar74 = vmaxps_avx(auVar110,auVar74);
            auVar110 = vmaxps_avx(auVar265,auVar322);
            auVar287 = vmaxps_avx(auVar278,auVar121);
            auVar110 = vmaxps_avx(auVar287,auVar110);
            auVar74 = vhaddps_avx(auVar74,auVar110);
            auVar16 = vshufps_avx(auVar16,auVar16,0xe8);
            auVar74 = vshufps_avx(auVar74,auVar74,0xe8);
            auVar279._0_4_ = auVar190._0_4_ + auVar16._0_4_;
            auVar279._4_4_ = auVar190._4_4_ + auVar16._4_4_;
            auVar279._8_4_ = auVar190._8_4_ + auVar16._8_4_;
            auVar279._12_4_ = auVar190._12_4_ + auVar16._12_4_;
            auVar266._0_4_ = auVar190._0_4_ + auVar74._0_4_;
            auVar266._4_4_ = auVar190._4_4_ + auVar74._4_4_;
            auVar266._8_4_ = auVar190._8_4_ + auVar74._8_4_;
            auVar266._12_4_ = auVar190._12_4_ + auVar74._12_4_;
            auVar16 = vmaxps_avx(auVar293,auVar279);
            auVar74 = vminps_avx(auVar266,auVar72);
            auVar16 = vcmpps_avx(auVar74,auVar16,1);
            auVar16 = vshufps_avx(auVar16,auVar16,0x50);
            if ((auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar16[0xf]) {
              bVar64 = 0;
              if ((fVar70 < auVar279._0_4_) && (bVar64 = 0, auVar266._0_4_ < auVar72._0_4_)) {
                auVar74 = vmovshdup_avx(auVar279);
                auVar16 = vcmpps_avx(auVar266,auVar72,1);
                bVar64 = auVar16[4] & auVar204._0_4_ < auVar74._0_4_;
              }
              if (((3 < uVar68 || fVar99 < 0.001) | bVar64) != 1) goto LAB_016e08ba;
              lVar63 = 200;
              do {
                fVar142 = auVar190._0_4_;
                fVar70 = 1.0 - fVar142;
                fVar99 = fVar70 * fVar70 * fVar70;
                fVar147 = fVar142 * 3.0 * fVar70 * fVar70;
                fVar70 = fVar70 * fVar142 * fVar142 * 3.0;
                auVar179._4_4_ = fVar99;
                auVar179._0_4_ = fVar99;
                auVar179._8_4_ = fVar99;
                auVar179._12_4_ = fVar99;
                auVar141._4_4_ = fVar147;
                auVar141._0_4_ = fVar147;
                auVar141._8_4_ = fVar147;
                auVar141._12_4_ = fVar147;
                auVar122._4_4_ = fVar70;
                auVar122._0_4_ = fVar70;
                auVar122._8_4_ = fVar70;
                auVar122._12_4_ = fVar70;
                fVar142 = fVar142 * fVar142 * fVar142;
                local_650 = auVar21._0_4_;
                fStack_64c = auVar21._4_4_;
                fStack_648 = auVar21._8_4_;
                fStack_644 = auVar21._12_4_;
                auVar198._0_4_ = fVar142 * local_650;
                auVar198._4_4_ = fVar142 * fStack_64c;
                auVar198._8_4_ = fVar142 * fStack_648;
                auVar198._12_4_ = fVar142 * fStack_644;
                auVar15 = vfmadd231ps_fma(auVar198,auVar122,auVar20);
                auVar15 = vfmadd231ps_fma(auVar15,auVar141,auVar19);
                auVar15 = vfmadd231ps_fma(auVar15,auVar18,auVar179);
                auVar123._8_8_ = auVar15._0_8_;
                auVar123._0_8_ = auVar15._0_8_;
                auVar15 = vshufpd_avx(auVar15,auVar15,3);
                auVar16 = vshufps_avx(auVar190,auVar190,0x55);
                auVar15 = vsubps_avx(auVar15,auVar123);
                auVar16 = vfmadd213ps_fma(auVar15,auVar16,auVar123);
                fVar99 = auVar16._0_4_;
                auVar15 = vshufps_avx(auVar16,auVar16,0x55);
                auVar124._0_4_ = fVar146 * fVar99 + fVar129 * auVar15._0_4_;
                auVar124._4_4_ = auVar158._4_4_ * fVar99 + auVar73._4_4_ * auVar15._4_4_;
                auVar124._8_4_ = auVar158._8_4_ * fVar99 + auVar73._8_4_ * auVar15._8_4_;
                auVar124._12_4_ = auVar158._12_4_ * fVar99 + auVar73._12_4_ * auVar15._12_4_;
                auVar190 = vsubps_avx(auVar190,auVar124);
                auVar15 = vandps_avx(local_4c0,auVar16);
                auVar16 = vshufps_avx(auVar15,auVar15,0xf5);
                auVar15 = vmaxss_avx(auVar16,auVar15);
                if (auVar15._0_4_ < fVar98) {
                  local_120 = auVar190._0_4_;
                  if ((local_120 < 0.0) || (1.0 < local_120)) break;
                  auVar15 = vmovshdup_avx(auVar190);
                  fVar99 = auVar15._0_4_;
                  if ((fVar99 < 0.0) || (1.0 < fVar99)) break;
                  auVar16 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar287 = vinsertps_avx(auVar16,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                 [2]),0x28);
                  auVar16 = vdpps_avx(auVar287,local_4d0,0x7f);
                  auVar158 = vdpps_avx(auVar287,local_4e0,0x7f);
                  auVar73 = vdpps_avx(auVar287,local_3c0,0x7f);
                  auVar74 = vdpps_avx(auVar287,local_3d0,0x7f);
                  auVar293 = vdpps_avx(auVar287,local_3e0,0x7f);
                  auVar72 = vdpps_avx(auVar287,local_3f0,0x7f);
                  auVar110 = vdpps_avx(auVar287,local_400,0x7f);
                  auVar287 = vdpps_avx(auVar287,local_410,0x7f);
                  fVar147 = 1.0 - fVar99;
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * auVar293._0_4_)),
                                            ZEXT416((uint)fVar147),auVar16);
                  auVar158 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * fVar99)),
                                             ZEXT416((uint)fVar147),auVar158);
                  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar110._0_4_ * fVar99)),
                                            ZEXT416((uint)fVar147),auVar73);
                  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * auVar287._0_4_)),
                                            ZEXT416((uint)fVar147),auVar74);
                  fVar129 = 1.0 - local_120;
                  fVar147 = fVar129 * local_120 * local_120 * 3.0;
                  fVar143 = local_120 * local_120 * local_120;
                  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * auVar74._0_4_)),
                                            ZEXT416((uint)fVar147),auVar73);
                  fVar70 = local_120 * 3.0 * fVar129 * fVar129;
                  auVar158 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar70),auVar158);
                  fVar146 = fVar129 * fVar129 * fVar129;
                  auVar16 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar146),auVar16);
                  fVar142 = auVar16._0_4_;
                  if (((fVar142 < fVar69) ||
                      (fVar144 = *(float *)(ray + k * 4 + 0x100), fVar144 < fVar142)) ||
                     (pGVar8 = (context->scene->geometries).items[uVar60].ptr,
                     (pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                  auVar16 = vshufps_avx(auVar190,auVar190,0x55);
                  auVar267._8_4_ = 0x3f800000;
                  auVar267._0_8_ = 0x3f8000003f800000;
                  auVar267._12_4_ = 0x3f800000;
                  auVar158 = vsubps_avx(auVar267,auVar16);
                  fVar167 = auVar16._0_4_;
                  auVar280._0_4_ = fVar167 * (float)local_510._0_4_;
                  fVar233 = auVar16._4_4_;
                  auVar280._4_4_ = fVar233 * (float)local_510._4_4_;
                  fVar234 = auVar16._8_4_;
                  auVar280._8_4_ = fVar234 * fStack_508;
                  fVar235 = auVar16._12_4_;
                  auVar280._12_4_ = fVar235 * fStack_504;
                  auVar290._0_4_ = fVar167 * (float)local_520._0_4_;
                  auVar290._4_4_ = fVar233 * (float)local_520._4_4_;
                  auVar290._8_4_ = fVar234 * fStack_518;
                  auVar290._12_4_ = fVar235 * fStack_514;
                  local_5d0 = auVar24._0_4_;
                  fStack_5cc = auVar24._4_4_;
                  fStack_5c8 = auVar24._8_4_;
                  fStack_5c4 = auVar24._12_4_;
                  auVar297._0_4_ = fVar167 * local_5d0;
                  auVar297._4_4_ = fVar233 * fStack_5cc;
                  auVar297._8_4_ = fVar234 * fStack_5c8;
                  auVar297._12_4_ = fVar235 * fStack_5c4;
                  local_5e0 = auVar328._0_4_;
                  fStack_5dc = auVar328._4_4_;
                  fStack_5d8 = auVar328._8_4_;
                  fStack_5d4 = auVar328._12_4_;
                  auVar250._0_4_ = fVar167 * local_5e0;
                  auVar250._4_4_ = fVar233 * fStack_5dc;
                  auVar250._8_4_ = fVar234 * fStack_5d8;
                  auVar250._12_4_ = fVar235 * fStack_5d4;
                  auVar16 = vfmadd231ps_fma(auVar280,auVar158,local_4f0);
                  auVar73 = vfmadd231ps_fma(auVar290,auVar158,auVar22);
                  auVar74 = vfmadd231ps_fma(auVar297,auVar158,local_500);
                  auVar293 = vfmadd231ps_fma(auVar250,auVar158,auVar23);
                  auVar16 = vsubps_avx(auVar73,auVar16);
                  auVar158 = vsubps_avx(auVar74,auVar73);
                  auVar73 = vsubps_avx(auVar293,auVar74);
                  auVar298._0_4_ = local_120 * auVar158._0_4_;
                  auVar298._4_4_ = local_120 * auVar158._4_4_;
                  auVar298._8_4_ = local_120 * auVar158._8_4_;
                  auVar298._12_4_ = local_120 * auVar158._12_4_;
                  auVar229._4_4_ = fVar129;
                  auVar229._0_4_ = fVar129;
                  auVar229._8_4_ = fVar129;
                  auVar229._12_4_ = fVar129;
                  auVar16 = vfmadd231ps_fma(auVar298,auVar229,auVar16);
                  auVar251._0_4_ = local_120 * auVar73._0_4_;
                  auVar251._4_4_ = local_120 * auVar73._4_4_;
                  auVar251._8_4_ = local_120 * auVar73._8_4_;
                  auVar251._12_4_ = local_120 * auVar73._12_4_;
                  auVar158 = vfmadd231ps_fma(auVar251,auVar229,auVar158);
                  auVar252._0_4_ = local_120 * auVar158._0_4_;
                  auVar252._4_4_ = local_120 * auVar158._4_4_;
                  auVar252._8_4_ = local_120 * auVar158._8_4_;
                  auVar252._12_4_ = local_120 * auVar158._12_4_;
                  auVar158 = vfmadd231ps_fma(auVar252,auVar229,auVar16);
                  auVar218._0_4_ = fVar143 * (float)local_460._0_4_;
                  auVar218._4_4_ = fVar143 * (float)local_460._4_4_;
                  auVar218._8_4_ = fVar143 * fStack_458;
                  auVar218._12_4_ = fVar143 * fStack_454;
                  auVar161._4_4_ = fVar147;
                  auVar161._0_4_ = fVar147;
                  auVar161._8_4_ = fVar147;
                  auVar161._12_4_ = fVar147;
                  auVar16 = vfmadd132ps_fma(auVar161,auVar218,local_450);
                  auVar199._4_4_ = fVar70;
                  auVar199._0_4_ = fVar70;
                  auVar199._8_4_ = fVar70;
                  auVar199._12_4_ = fVar70;
                  auVar16 = vfmadd132ps_fma(auVar199,auVar16,local_440);
                  auVar219._0_4_ = auVar158._0_4_ * 3.0;
                  auVar219._4_4_ = auVar158._4_4_ * 3.0;
                  auVar219._8_4_ = auVar158._8_4_ * 3.0;
                  auVar219._12_4_ = auVar158._12_4_ * 3.0;
                  auVar180._4_4_ = fVar146;
                  auVar180._0_4_ = fVar146;
                  auVar180._8_4_ = fVar146;
                  auVar180._12_4_ = fVar146;
                  auVar158 = vfmadd132ps_fma(auVar180,auVar16,local_430);
                  auVar16 = vshufps_avx(auVar219,auVar219,0xc9);
                  auVar162._0_4_ = auVar158._0_4_ * auVar16._0_4_;
                  auVar162._4_4_ = auVar158._4_4_ * auVar16._4_4_;
                  auVar162._8_4_ = auVar158._8_4_ * auVar16._8_4_;
                  auVar162._12_4_ = auVar158._12_4_ * auVar16._12_4_;
                  auVar16 = vshufps_avx(auVar158,auVar158,0xc9);
                  auVar16 = vfmsub231ps_fma(auVar162,auVar219,auVar16);
                  local_140 = auVar16._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar142;
                    uVar71 = vextractps_avx(auVar16,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar71;
                    uVar71 = vextractps_avx(auVar16,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar71;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar99;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar60;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_100 = auVar15._0_8_;
                  auVar15 = vmovshdup_avx(auVar16);
                  local_180 = auVar15._0_8_;
                  auVar15 = vshufps_avx(auVar16,auVar16,0xaa);
                  local_160 = auVar15._0_8_;
                  uStack_178 = local_180;
                  uStack_170 = local_180;
                  uStack_168 = local_180;
                  uStack_158 = local_160;
                  uStack_150 = local_160;
                  uStack_148 = local_160;
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  uStack_f8 = local_100;
                  uStack_f0 = local_100;
                  uStack_e8 = local_100;
                  local_e0 = CONCAT44(uStack_31c,local_320);
                  uStack_d8 = CONCAT44(uStack_314,uStack_318);
                  uStack_d0 = CONCAT44(uStack_30c,uStack_310);
                  uStack_c8 = CONCAT44(uStack_304,uStack_308);
                  local_c0._4_4_ = uStack_2fc;
                  local_c0._0_4_ = local_300;
                  local_c0._8_4_ = uStack_2f8;
                  local_c0._12_4_ = uStack_2f4;
                  local_c0._16_4_ = uStack_2f0;
                  local_c0._20_4_ = uStack_2ec;
                  local_c0._24_4_ = uStack_2e8;
                  local_c0._28_4_ = uStack_2e4;
                  vpcmpeqd_avx2(local_c0,local_c0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar142;
                  local_4a0 = local_340;
                  local_550.valid = (int *)local_4a0;
                  local_550.geometryUserPtr = pGVar8->userPtr;
                  local_550.context = context->user;
                  local_550.hit = (RTCHitN *)&local_180;
                  local_550.N = 8;
                  local_550.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_550);
                  }
                  auVar93 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                  auVar93 = _DAT_01fe9960 & ~auVar93;
                  if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar93 >> 0x7f,0) != '\0') ||
                        (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar93 >> 0xbf,0) != '\0') ||
                      (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar93[0x1f] < '\0') {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_550);
                    }
                    auVar26 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                    auVar93 = _DAT_01fe9960 & ~auVar26;
                    if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar93 >> 0x7f,0) != '\0') ||
                          (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar93 >> 0xbf,0) != '\0') ||
                        (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar93[0x1f] < '\0') {
                      auVar97._0_8_ = auVar26._0_8_ ^ 0xffffffffffffffff;
                      auVar97._8_4_ = auVar26._8_4_ ^ 0xffffffff;
                      auVar97._12_4_ = auVar26._12_4_ ^ 0xffffffff;
                      auVar97._16_4_ = auVar26._16_4_ ^ 0xffffffff;
                      auVar97._20_4_ = auVar26._20_4_ ^ 0xffffffff;
                      auVar97._24_4_ = auVar26._24_4_ ^ 0xffffffff;
                      auVar97._28_4_ = auVar26._28_4_ ^ 0xffffffff;
                      auVar93 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])local_550.hit);
                      *(undefined1 (*) [32])(local_550.ray + 0x180) = auVar93;
                      auVar93 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_550.hit + 0x20))
                      ;
                      *(undefined1 (*) [32])(local_550.ray + 0x1a0) = auVar93;
                      auVar93 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_550.hit + 0x40))
                      ;
                      *(undefined1 (*) [32])(local_550.ray + 0x1c0) = auVar93;
                      auVar93 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_550.hit + 0x60))
                      ;
                      *(undefined1 (*) [32])(local_550.ray + 0x1e0) = auVar93;
                      auVar93 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_550.hit + 0x80))
                      ;
                      *(undefined1 (*) [32])(local_550.ray + 0x200) = auVar93;
                      auVar93 = vpmaskmovd_avx2(auVar97,*(undefined1 (*) [32])(local_550.hit + 0xa0)
                                               );
                      *(undefined1 (*) [32])(local_550.ray + 0x220) = auVar93;
                      auVar93 = vpmaskmovd_avx2(auVar97,*(undefined1 (*) [32])(local_550.hit + 0xc0)
                                               );
                      *(undefined1 (*) [32])(local_550.ray + 0x240) = auVar93;
                      auVar93 = vpmaskmovd_avx2(auVar97,*(undefined1 (*) [32])(local_550.hit + 0xe0)
                                               );
                      *(undefined1 (*) [32])(local_550.ray + 0x260) = auVar93;
                      auVar93 = vpmaskmovd_avx2(auVar97,*(undefined1 (*) [32])
                                                         (local_550.hit + 0x100));
                      *(undefined1 (*) [32])(local_550.ray + 0x280) = auVar93;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar144;
                  break;
                }
                lVar63 = lVar63 + -1;
              } while (lVar63 != 0);
            }
          }
        }
        else {
          auVar293 = vcmpps_avx(auVar293,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar110 = vcmpps_avx(auVar72,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar293 = vandps_avx(auVar110,auVar293);
          if (-0.0001 < fVar129 && (auVar293 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_016dfc47;
        }
        if (uVar68 == 0) break;
      } while( true );
    }
    uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar92._4_4_ = uVar71;
    auVar92._0_4_ = uVar71;
    auVar92._8_4_ = uVar71;
    auVar92._12_4_ = uVar71;
    auVar15 = vcmpps_avx(local_470,auVar92,2);
    uVar60 = vmovmskps_avx(auVar15);
    uVar58 = uVar58 & local_588 & uVar60;
    if (uVar58 == 0) {
      return;
    }
  } while( true );
LAB_016e08ba:
  auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)fVar147),0x10);
  auVar291 = ZEXT1664(auVar15);
  auVar15 = vinsertps_avx(auVar204,ZEXT416((uint)auVar221._0_4_),0x10);
  auVar201 = ZEXT1664(auVar15);
  goto LAB_016df388;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }